

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersectorK<4,8>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx512::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  undefined4 uVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  ulong uVar26;
  undefined8 uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  byte bVar69;
  ulong uVar70;
  uint uVar71;
  long lVar72;
  Geometry *pGVar73;
  long lVar74;
  undefined8 unaff_R13;
  ulong uVar75;
  ulong uVar76;
  uint uVar77;
  byte bVar78;
  float fVar79;
  float fVar80;
  float fVar136;
  float fVar138;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar92 [16];
  float fVar137;
  float fVar139;
  float fVar140;
  float fVar141;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  float fVar142;
  float fVar143;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined4 uVar144;
  float fVar158;
  float fVar159;
  vint4 bi_2;
  float fVar160;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  vint4 bi_1;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  float fVar166;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  float fVar172;
  float fVar173;
  float fVar190;
  vint4 ai_2;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  vint4 bi;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [64];
  vint4 ai;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar209 [64];
  vint4 ai_1;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [64];
  undefined1 auVar214 [64];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [16];
  undefined1 auVar220 [64];
  undefined1 auVar221 [32];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [64];
  undefined1 auVar228 [64];
  undefined1 auVar229 [64];
  undefined1 auVar230 [64];
  RTCFilterFunctionNArguments args;
  float local_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  RTCFilterFunctionNArguments local_670;
  undefined1 local_640 [16];
  undefined1 (*local_628) [32];
  undefined1 local_620 [32];
  LinearSpace3fa *local_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined4 local_520;
  undefined4 uStack_51c;
  undefined4 uStack_518;
  undefined4 uStack_514;
  undefined4 uStack_510;
  undefined4 uStack_50c;
  undefined4 uStack_508;
  undefined4 uStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined4 uStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined4 local_3a0;
  int local_39c;
  undefined1 local_390 [16];
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  float local_340 [4];
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  int local_240;
  int iStack_23c;
  int iStack_238;
  int iStack_234;
  int iStack_230;
  int iStack_22c;
  int iStack_228;
  int iStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 local_180 [32];
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  undefined1 local_120 [32];
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  
  uVar70 = (ulong)(byte)prim[1];
  fVar166 = *(float *)(prim + uVar70 * 0x19 + 0x12);
  auVar84 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar84 = vinsertps_avx(auVar84,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar85 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar85 = vinsertps_avx(auVar85,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar84 = vsubps_avx(auVar84,*(undefined1 (*) [16])(prim + uVar70 * 0x19 + 6));
  auVar174._0_4_ = fVar166 * auVar84._0_4_;
  auVar174._4_4_ = fVar166 * auVar84._4_4_;
  auVar174._8_4_ = fVar166 * auVar84._8_4_;
  auVar174._12_4_ = fVar166 * auVar84._12_4_;
  auVar88._0_4_ = fVar166 * auVar85._0_4_;
  auVar88._4_4_ = fVar166 * auVar85._4_4_;
  auVar88._8_4_ = fVar166 * auVar85._8_4_;
  auVar88._12_4_ = fVar166 * auVar85._12_4_;
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 4 + 6)));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 5 + 6)));
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 6 + 6)));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar147 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0xb + 6)));
  auVar147 = vcvtdq2ps_avx(auVar147);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0xc + 6)));
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0xd + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x12 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x13 + 6)));
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x14 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar222._4_4_ = auVar88._0_4_;
  auVar222._0_4_ = auVar88._0_4_;
  auVar222._8_4_ = auVar88._0_4_;
  auVar222._12_4_ = auVar88._0_4_;
  auVar91 = vshufps_avx(auVar88,auVar88,0x55);
  auVar86 = vshufps_avx(auVar88,auVar88,0xaa);
  fVar166 = auVar86._0_4_;
  auVar191._0_4_ = fVar166 * auVar81._0_4_;
  fVar158 = auVar86._4_4_;
  auVar191._4_4_ = fVar158 * auVar81._4_4_;
  fVar159 = auVar86._8_4_;
  auVar191._8_4_ = fVar159 * auVar81._8_4_;
  fVar160 = auVar86._12_4_;
  auVar191._12_4_ = fVar160 * auVar81._12_4_;
  auVar89._0_4_ = auVar82._0_4_ * fVar166;
  auVar89._4_4_ = auVar82._4_4_ * fVar158;
  auVar89._8_4_ = auVar82._8_4_ * fVar159;
  auVar89._12_4_ = auVar82._12_4_ * fVar160;
  auVar145._0_4_ = auVar83._0_4_ * fVar166;
  auVar145._4_4_ = auVar83._4_4_ * fVar158;
  auVar145._8_4_ = auVar83._8_4_ * fVar159;
  auVar145._12_4_ = auVar83._12_4_ * fVar160;
  auVar86 = vfmadd231ps_fma(auVar191,auVar91,auVar85);
  auVar87 = vfmadd231ps_fma(auVar89,auVar91,auVar20);
  auVar91 = vfmadd231ps_fma(auVar145,auVar22,auVar91);
  auVar90 = vfmadd231ps_fma(auVar86,auVar222,auVar84);
  auVar87 = vfmadd231ps_fma(auVar87,auVar222,auVar147);
  auVar88 = vfmadd231ps_fma(auVar91,auVar21,auVar222);
  auVar223._4_4_ = auVar174._0_4_;
  auVar223._0_4_ = auVar174._0_4_;
  auVar223._8_4_ = auVar174._0_4_;
  auVar223._12_4_ = auVar174._0_4_;
  auVar91 = vshufps_avx(auVar174,auVar174,0x55);
  auVar86 = vshufps_avx(auVar174,auVar174,0xaa);
  auVar81 = vmulps_avx512vl(auVar86,auVar81);
  auVar175._0_4_ = auVar86._0_4_ * auVar82._0_4_;
  auVar175._4_4_ = auVar86._4_4_ * auVar82._4_4_;
  auVar175._8_4_ = auVar86._8_4_ * auVar82._8_4_;
  auVar175._12_4_ = auVar86._12_4_ * auVar82._12_4_;
  auVar92._0_4_ = auVar86._0_4_ * auVar83._0_4_;
  auVar92._4_4_ = auVar86._4_4_ * auVar83._4_4_;
  auVar92._8_4_ = auVar86._8_4_ * auVar83._8_4_;
  auVar92._12_4_ = auVar86._12_4_ * auVar83._12_4_;
  auVar82 = vfmadd231ps_avx512vl(auVar81,auVar91,auVar85);
  auVar85 = vfmadd231ps_fma(auVar175,auVar91,auVar20);
  auVar81 = vfmadd231ps_fma(auVar92,auVar91,auVar22);
  auVar83 = vfmadd231ps_avx512vl(auVar82,auVar223,auVar84);
  auVar20 = vfmadd231ps_fma(auVar85,auVar223,auVar147);
  auVar22 = vfmadd231ps_fma(auVar81,auVar223,auVar21);
  auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar228 = ZEXT1664(auVar84);
  auVar199._8_4_ = 0x219392ef;
  auVar199._0_8_ = 0x219392ef219392ef;
  auVar199._12_4_ = 0x219392ef;
  auVar85 = vandps_avx512vl(auVar90,auVar84);
  uVar75 = vcmpps_avx512vl(auVar85,auVar199,1);
  bVar13 = (bool)((byte)uVar75 & 1);
  auVar86._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar90._0_4_;
  bVar13 = (bool)((byte)(uVar75 >> 1) & 1);
  auVar86._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar90._4_4_;
  bVar13 = (bool)((byte)(uVar75 >> 2) & 1);
  auVar86._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar90._8_4_;
  bVar13 = (bool)((byte)(uVar75 >> 3) & 1);
  auVar86._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar90._12_4_;
  auVar85 = vandps_avx512vl(auVar87,auVar84);
  uVar75 = vcmpps_avx512vl(auVar85,auVar199,1);
  bVar13 = (bool)((byte)uVar75 & 1);
  auVar90._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar87._0_4_;
  bVar13 = (bool)((byte)(uVar75 >> 1) & 1);
  auVar90._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar87._4_4_;
  bVar13 = (bool)((byte)(uVar75 >> 2) & 1);
  auVar90._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar87._8_4_;
  bVar13 = (bool)((byte)(uVar75 >> 3) & 1);
  auVar90._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar87._12_4_;
  auVar84 = vandps_avx512vl(auVar88,auVar84);
  uVar75 = vcmpps_avx512vl(auVar84,auVar199,1);
  bVar13 = (bool)((byte)uVar75 & 1);
  auVar87._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar88._0_4_;
  bVar13 = (bool)((byte)(uVar75 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar88._4_4_;
  bVar13 = (bool)((byte)(uVar75 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar88._8_4_;
  bVar13 = (bool)((byte)(uVar75 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar88._12_4_;
  auVar85 = vrcp14ps_avx512vl(auVar86);
  auVar210._8_4_ = 0x3f800000;
  auVar210._0_8_ = 0x3f8000003f800000;
  auVar210._12_4_ = 0x3f800000;
  auVar84 = vfnmadd213ps_fma(auVar86,auVar85,auVar210);
  auVar81 = vfmadd132ps_fma(auVar84,auVar85,auVar85);
  auVar85 = vrcp14ps_avx512vl(auVar90);
  auVar84 = vfnmadd213ps_fma(auVar90,auVar85,auVar210);
  auVar82 = vfmadd132ps_fma(auVar84,auVar85,auVar85);
  auVar85 = vrcp14ps_avx512vl(auVar87);
  auVar84 = vfnmadd213ps_fma(auVar87,auVar85,auVar210);
  auVar21 = vfmadd132ps_fma(auVar84,auVar85,auVar85);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar70 * 7 + 6);
  auVar84 = vpmovsxwd_avx(auVar84);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx512vl(auVar84,auVar83);
  auVar200._0_4_ = auVar81._0_4_ * auVar84._0_4_;
  auVar200._4_4_ = auVar81._4_4_ * auVar84._4_4_;
  auVar200._8_4_ = auVar81._8_4_ * auVar84._8_4_;
  auVar200._12_4_ = auVar81._12_4_ * auVar84._12_4_;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar70 * 9 + 6);
  auVar84 = vpmovsxwd_avx(auVar85);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx512vl(auVar84,auVar83);
  auVar192._0_4_ = auVar81._0_4_ * auVar84._0_4_;
  auVar192._4_4_ = auVar81._4_4_ * auVar84._4_4_;
  auVar192._8_4_ = auVar81._8_4_ * auVar84._8_4_;
  auVar192._12_4_ = auVar81._12_4_ * auVar84._12_4_;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar70 * 0xe + 6);
  auVar84 = vpmovsxwd_avx(auVar81);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar20);
  auVar211._0_4_ = auVar82._0_4_ * auVar84._0_4_;
  auVar211._4_4_ = auVar82._4_4_ * auVar84._4_4_;
  auVar211._8_4_ = auVar82._8_4_ * auVar84._8_4_;
  auVar211._12_4_ = auVar82._12_4_ * auVar84._12_4_;
  auVar81 = vpbroadcastd_avx512vl();
  auVar147._8_8_ = 0;
  auVar147._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar84 = vpmovsxwd_avx(auVar147);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar85 = vsubps_avx(auVar84,auVar20);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar70 * 0x15 + 6);
  auVar84 = vpmovsxwd_avx(auVar20);
  auVar161._0_4_ = auVar82._0_4_ * auVar85._0_4_;
  auVar161._4_4_ = auVar82._4_4_ * auVar85._4_4_;
  auVar161._8_4_ = auVar82._8_4_ * auVar85._8_4_;
  auVar161._12_4_ = auVar82._12_4_ * auVar85._12_4_;
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar22);
  auVar176._0_4_ = auVar21._0_4_ * auVar84._0_4_;
  auVar176._4_4_ = auVar21._4_4_ * auVar84._4_4_;
  auVar176._8_4_ = auVar21._8_4_ * auVar84._8_4_;
  auVar176._12_4_ = auVar21._12_4_ * auVar84._12_4_;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar70 * 0x17 + 6);
  auVar84 = vpmovsxwd_avx(auVar82);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar22);
  auVar146._0_4_ = auVar21._0_4_ * auVar84._0_4_;
  auVar146._4_4_ = auVar21._4_4_ * auVar84._4_4_;
  auVar146._8_4_ = auVar21._8_4_ * auVar84._8_4_;
  auVar146._12_4_ = auVar21._12_4_ * auVar84._12_4_;
  auVar84 = vpminsd_avx(auVar200,auVar192);
  auVar85 = vpminsd_avx(auVar211,auVar161);
  auVar84 = vmaxps_avx(auVar84,auVar85);
  auVar85 = vpminsd_avx(auVar176,auVar146);
  uVar144 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar21._4_4_ = uVar144;
  auVar21._0_4_ = uVar144;
  auVar21._8_4_ = uVar144;
  auVar21._12_4_ = uVar144;
  auVar85 = vmaxps_avx512vl(auVar85,auVar21);
  auVar84 = vmaxps_avx(auVar84,auVar85);
  auVar22._8_4_ = 0x3f7ffffa;
  auVar22._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar22._12_4_ = 0x3f7ffffa;
  local_2d0 = vmulps_avx512vl(auVar84,auVar22);
  auVar84 = vpmaxsd_avx(auVar200,auVar192);
  auVar85 = vpmaxsd_avx(auVar211,auVar161);
  auVar84 = vminps_avx(auVar84,auVar85);
  auVar85 = vpmaxsd_avx(auVar176,auVar146);
  uVar144 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar83._4_4_ = uVar144;
  auVar83._0_4_ = uVar144;
  auVar83._8_4_ = uVar144;
  auVar83._12_4_ = uVar144;
  auVar85 = vminps_avx512vl(auVar85,auVar83);
  auVar84 = vminps_avx(auVar84,auVar85);
  auVar91._8_4_ = 0x3f800003;
  auVar91._0_8_ = 0x3f8000033f800003;
  auVar91._12_4_ = 0x3f800003;
  auVar84 = vmulps_avx512vl(auVar84,auVar91);
  uVar23 = vcmpps_avx512vl(local_2d0,auVar84,2);
  uVar27 = vpcmpgtd_avx512vl(auVar81,_DAT_01f4ad30);
  uVar75 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)((byte)uVar23 & 0xf & (byte)uVar27));
  local_5e8 = pre->ray_space + k;
  local_628 = (undefined1 (*) [32])&local_160;
  local_2c0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  do {
    if (uVar75 == 0) {
      return;
    }
    lVar74 = 0;
    for (uVar70 = uVar75; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000) {
      lVar74 = lVar74 + 1;
    }
    uVar8 = *(uint *)(prim + 2);
    uVar9 = *(uint *)(prim + lVar74 * 4 + 6);
    pGVar73 = (context->scene->geometries).items[uVar8].ptr;
    uVar70 = (ulong)*(uint *)(*(long *)&pGVar73->field_0x58 +
                             pGVar73[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i * (ulong)uVar9);
    p_Var12 = pGVar73[1].intersectionFilterN;
    lVar74 = *(long *)&pGVar73[1].time_range.upper;
    auVar84 = *(undefined1 (*) [16])(lVar74 + (long)p_Var12 * uVar70);
    pauVar3 = (undefined1 (*) [16])(lVar74 + (uVar70 + 1) * (long)p_Var12);
    uVar23 = *(undefined8 *)*pauVar3;
    uVar27 = *(undefined8 *)(*pauVar3 + 8);
    auVar83 = *pauVar3;
    auVar21 = *pauVar3;
    auVar20 = *pauVar3;
    auVar85 = *pauVar3;
    pauVar4 = (undefined1 (*) [16])(lVar74 + (uVar70 + 2) * (long)p_Var12);
    uVar62 = *(undefined8 *)*pauVar4;
    uVar63 = *(undefined8 *)(*pauVar4 + 8);
    auVar22 = *pauVar4;
    auVar82 = *pauVar4;
    auVar147 = *pauVar4;
    auVar81 = *pauVar4;
    uVar75 = uVar75 - 1 & uVar75;
    pauVar5 = (undefined1 (*) [12])(lVar74 + (uVar70 + 3) * (long)p_Var12);
    uVar64 = *(undefined8 *)*pauVar5;
    uVar65 = *(undefined8 *)(*pauVar5 + 8);
    local_6d0 = (float)uVar64;
    fStack_6cc = (float)((ulong)uVar64 >> 0x20);
    fStack_6c8 = (float)uVar65;
    fStack_6c4 = (float)((ulong)uVar65 >> 0x20);
    if (uVar75 != 0) {
      uVar76 = uVar75 - 1 & uVar75;
      for (uVar70 = uVar75; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000) {
      }
      if (uVar76 != 0) {
        for (; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
        }
      }
    }
    iVar10 = (int)pGVar73[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar91 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                            0x1c);
    auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar87 = vsubps_avx(auVar84,auVar91);
    uVar144 = auVar87._0_4_;
    auVar167._4_4_ = uVar144;
    auVar167._0_4_ = uVar144;
    auVar167._8_4_ = uVar144;
    auVar167._12_4_ = uVar144;
    auVar86 = vshufps_avx(auVar87,auVar87,0x55);
    aVar6 = (local_5e8->vx).field_0;
    aVar7 = (local_5e8->vy).field_0;
    auVar87 = vshufps_avx(auVar87,auVar87,0xaa);
    fVar166 = (local_5e8->vz).field_0.m128[0];
    fVar158 = *(float *)((long)&(local_5e8->vz).field_0 + 4);
    fVar159 = *(float *)((long)&(local_5e8->vz).field_0 + 8);
    fVar160 = *(float *)((long)&(local_5e8->vz).field_0 + 0xc);
    auVar215._0_4_ = fVar166 * auVar87._0_4_;
    auVar215._4_4_ = fVar158 * auVar87._4_4_;
    auVar215._8_4_ = fVar159 * auVar87._8_4_;
    auVar215._12_4_ = fVar160 * auVar87._12_4_;
    auVar86 = vfmadd231ps_fma(auVar215,(undefined1  [16])aVar7,auVar86);
    auVar145 = vfmadd231ps_fma(auVar86,(undefined1  [16])aVar6,auVar167);
    auVar86 = vshufps_avx(auVar84,auVar84,0xff);
    auVar90 = vsubps_avx(auVar85,auVar91);
    uVar144 = auVar90._0_4_;
    auVar177._4_4_ = uVar144;
    auVar177._0_4_ = uVar144;
    auVar177._8_4_ = uVar144;
    auVar177._12_4_ = uVar144;
    auVar87 = vshufps_avx(auVar90,auVar90,0x55);
    auVar90 = vshufps_avx(auVar90,auVar90,0xaa);
    auVar216._0_4_ = fVar166 * auVar90._0_4_;
    auVar216._4_4_ = fVar158 * auVar90._4_4_;
    auVar216._8_4_ = fVar159 * auVar90._8_4_;
    auVar216._12_4_ = fVar160 * auVar90._12_4_;
    auVar87 = vfmadd231ps_fma(auVar216,(undefined1  [16])aVar7,auVar87);
    auVar146 = vfmadd231ps_fma(auVar87,(undefined1  [16])aVar6,auVar177);
    auVar87 = vshufps_avx(auVar85,auVar85,0xff);
    auVar88 = vsubps_avx512vl(auVar81,auVar91);
    uVar144 = auVar88._0_4_;
    auVar212._4_4_ = uVar144;
    auVar212._0_4_ = uVar144;
    auVar212._8_4_ = uVar144;
    auVar212._12_4_ = uVar144;
    auVar90 = vshufps_avx(auVar88,auVar88,0x55);
    auVar88 = vshufps_avx(auVar88,auVar88,0xaa);
    auVar219._0_4_ = fVar166 * auVar88._0_4_;
    auVar219._4_4_ = fVar158 * auVar88._4_4_;
    auVar219._8_4_ = fVar159 * auVar88._8_4_;
    auVar219._12_4_ = fVar160 * auVar88._12_4_;
    auVar90 = vfmadd231ps_fma(auVar219,(undefined1  [16])aVar7,auVar90);
    auVar88 = vfmadd231ps_fma(auVar90,(undefined1  [16])aVar6,auVar212);
    auVar89 = vshufps_avx512vl(auVar81,auVar81,0xff);
    auVar66._12_4_ = fStack_6c4;
    auVar66._0_12_ = *pauVar5;
    auVar90 = vsubps_avx512vl(auVar66,auVar91);
    uVar144 = auVar90._0_4_;
    auVar178._4_4_ = uVar144;
    auVar178._0_4_ = uVar144;
    auVar178._8_4_ = uVar144;
    auVar178._12_4_ = uVar144;
    auVar91 = vshufps_avx(auVar90,auVar90,0x55);
    auVar90 = vshufps_avx(auVar90,auVar90,0xaa);
    auVar224._0_4_ = fVar166 * auVar90._0_4_;
    auVar224._4_4_ = fVar158 * auVar90._4_4_;
    auVar224._8_4_ = fVar159 * auVar90._8_4_;
    auVar224._12_4_ = fVar160 * auVar90._12_4_;
    auVar91 = vfmadd231ps_fma(auVar224,(undefined1  [16])aVar7,auVar91);
    auVar90 = vfmadd231ps_fma(auVar91,(undefined1  [16])aVar6,auVar178);
    auVar91 = vshufps_avx512vl(auVar66,auVar66,0xff);
    lVar74 = (long)iVar10 * 0x44;
    auVar109 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar74);
    uVar144 = auVar145._0_4_;
    local_420._4_4_ = uVar144;
    local_420._0_4_ = uVar144;
    local_420._8_4_ = uVar144;
    local_420._12_4_ = uVar144;
    local_420._16_4_ = uVar144;
    local_420._20_4_ = uVar144;
    local_420._24_4_ = uVar144;
    local_420._28_4_ = uVar144;
    auVar93._8_4_ = 1;
    auVar93._0_8_ = 0x100000001;
    auVar93._12_4_ = 1;
    auVar93._16_4_ = 1;
    auVar93._20_4_ = 1;
    auVar93._24_4_ = 1;
    auVar93._28_4_ = 1;
    local_440 = vpermps_avx2(auVar93,ZEXT1632(auVar145));
    local_80 = vbroadcastsd_avx512vl(auVar86);
    auVar110 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar74 + 0x484);
    uVar144 = auVar146._0_4_;
    auVar162._4_4_ = uVar144;
    auVar162._0_4_ = uVar144;
    auVar162._8_4_ = uVar144;
    auVar162._12_4_ = uVar144;
    local_460._16_4_ = uVar144;
    local_460._0_16_ = auVar162;
    local_460._20_4_ = uVar144;
    local_460._24_4_ = uVar144;
    local_460._28_4_ = uVar144;
    local_480 = vpermps_avx512vl(auVar93,ZEXT1632(auVar146));
    local_a0 = vbroadcastsd_avx512vl(auVar87);
    auVar107 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar74 + 0x908);
    uVar144 = auVar88._0_4_;
    local_4a0._4_4_ = uVar144;
    local_4a0._0_4_ = uVar144;
    local_4a0._8_4_ = uVar144;
    local_4a0._12_4_ = uVar144;
    local_4a0._16_4_ = uVar144;
    local_4a0._20_4_ = uVar144;
    local_4a0._24_4_ = uVar144;
    local_4a0._28_4_ = uVar144;
    local_4c0 = vpermps_avx512vl(auVar93,ZEXT1632(auVar88));
    local_c0 = vbroadcastsd_avx512vl(auVar89);
    auVar106 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar74 + 0xd8c);
    fVar158 = auVar90._0_4_;
    local_4e0._4_4_ = fVar158;
    local_4e0._0_4_ = fVar158;
    fStack_4d8 = fVar158;
    fStack_4d4 = fVar158;
    fStack_4d0 = fVar158;
    fStack_4cc = fVar158;
    fStack_4c8 = fVar158;
    register0x0000139c = fVar158;
    _local_500 = vpermps_avx512vl(auVar93,ZEXT1632(auVar90));
    local_e0 = vbroadcastsd_avx512vl(auVar91);
    auVar93 = vmulps_avx512vl(_local_4e0,auVar106);
    auVar94 = vmulps_avx512vl(_local_500,auVar106);
    auVar91 = vfmadd231ps_fma(auVar93,auVar107,local_4a0);
    auVar93 = vfmadd231ps_avx512vl(auVar94,auVar107,local_4c0);
    auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar110,local_460);
    auVar95 = vfmadd231ps_avx512vl(auVar93,auVar110,local_480);
    auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),auVar109,local_420);
    auVar209 = ZEXT3264(auVar96);
    auVar93 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar74);
    auVar94 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar74 + 0x484);
    auVar105 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar74 + 0x908);
    auVar97 = vfmadd231ps_avx512vl(auVar95,auVar109,local_440);
    auVar198 = ZEXT3264(auVar97);
    auVar95 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar74 + 0xd8c);
    auVar98 = vmulps_avx512vl(_local_4e0,auVar95);
    auVar99 = vmulps_avx512vl(_local_500,auVar95);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar105,local_4a0);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar105,local_4c0);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar94,local_460);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar94,local_480);
    auVar86 = vfmadd231ps_fma(auVar98,auVar93,local_420);
    auVar213 = ZEXT1664(auVar86);
    auVar87 = vfmadd231ps_fma(auVar99,auVar93,local_440);
    auVar98 = vsubps_avx512vl(ZEXT1632(auVar86),auVar96);
    auVar99 = vsubps_avx512vl(ZEXT1632(auVar87),auVar97);
    auVar100 = vmulps_avx512vl(auVar97,auVar98);
    auVar101 = vmulps_avx512vl(auVar96,auVar99);
    auVar100 = vsubps_avx512vl(auVar100,auVar101);
    auVar101 = vmulps_avx512vl(local_e0,auVar106);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar107,local_c0);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar110,local_a0);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar109,local_80);
    auVar102 = vmulps_avx512vl(local_e0,auVar95);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar105,local_c0);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar94,local_a0);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar93,local_80);
    auVar103 = vmulps_avx512vl(auVar99,auVar99);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar98,auVar98);
    auVar104 = vmaxps_avx512vl(auVar101,auVar102);
    auVar104 = vmulps_avx512vl(auVar104,auVar104);
    auVar103 = vmulps_avx512vl(auVar104,auVar103);
    auVar100 = vmulps_avx512vl(auVar100,auVar100);
    uVar24 = vcmpps_avx512vl(auVar100,auVar103,2);
    auVar91 = vblendps_avx(auVar145,auVar84,8);
    auVar89 = auVar228._0_16_;
    auVar91 = vandps_avx512vl(auVar91,auVar89);
    auVar85 = vblendps_avx(auVar146,auVar85,8);
    auVar85 = vandps_avx512vl(auVar85,auVar89);
    auVar91 = vmaxps_avx(auVar91,auVar85);
    auVar85 = vblendps_avx(auVar88,auVar81,8);
    auVar81 = vandps_avx512vl(auVar85,auVar89);
    auVar85 = vblendps_avx(auVar90,auVar66,8);
    auVar85 = vandps_avx512vl(auVar85,auVar89);
    auVar85 = vmaxps_avx(auVar81,auVar85);
    auVar85 = vmaxps_avx(auVar91,auVar85);
    auVar81 = vmovshdup_avx(auVar85);
    auVar81 = vmaxss_avx(auVar81,auVar85);
    auVar85 = vshufpd_avx(auVar85,auVar85,1);
    auVar85 = vmaxss_avx(auVar85,auVar81);
    auVar81 = vcvtsi2ss_avx512f(auVar89,iVar10);
    local_5a0._0_16_ = auVar81;
    auVar104._0_4_ = auVar81._0_4_;
    auVar104._4_4_ = auVar104._0_4_;
    auVar104._8_4_ = auVar104._0_4_;
    auVar104._12_4_ = auVar104._0_4_;
    auVar104._16_4_ = auVar104._0_4_;
    auVar104._20_4_ = auVar104._0_4_;
    auVar104._24_4_ = auVar104._0_4_;
    auVar104._28_4_ = auVar104._0_4_;
    uVar25 = vcmpps_avx512vl(auVar104,_DAT_01f7b060,0xe);
    bVar78 = (byte)uVar24 & (byte)uVar25;
    fVar166 = auVar85._0_4_ * 4.7683716e-07;
    local_640 = ZEXT416((uint)fVar166);
    auVar103._8_4_ = 2;
    auVar103._0_8_ = 0x200000002;
    auVar103._12_4_ = 2;
    auVar103._16_4_ = 2;
    auVar103._20_4_ = 2;
    auVar103._24_4_ = 2;
    auVar103._28_4_ = 2;
    local_560 = vpermps_avx512vl(auVar103,ZEXT1632(auVar145));
    auVar229 = ZEXT3264(local_560);
    local_580 = vpermps_avx512vl(auVar103,ZEXT1632(auVar146));
    auVar230 = ZEXT3264(local_580);
    auVar100 = vpermps_avx512vl(auVar103,ZEXT1632(auVar88));
    auVar227 = ZEXT3264(auVar100);
    local_260 = vpermps_avx2(auVar103,ZEXT1632(auVar90));
    local_520 = *(undefined4 *)(ray + k * 4 + 0x60);
    uStack_51c = 0;
    uStack_518 = 0;
    uStack_514 = 0;
    local_280 = vpbroadcastd_avx512vl();
    local_2a0 = vpbroadcastd_avx512vl();
    if (bVar78 != 0) {
      auVar95 = vmulps_avx512vl(local_260,auVar95);
      auVar105 = vfmadd213ps_avx512vl(auVar105,auVar100,auVar95);
      auVar94 = vfmadd213ps_avx512vl(auVar94,local_580,auVar105);
      auVar103 = vfmadd213ps_avx512vl(auVar93,local_560,auVar94);
      auVar106 = vmulps_avx512vl(local_260,auVar106);
      auVar107 = vfmadd213ps_avx512vl(auVar107,auVar100,auVar106);
      auVar94 = vfmadd213ps_avx512vl(auVar110,local_580,auVar107);
      auVar110 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar74 + 0x1210);
      auVar107 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar74 + 0x1694);
      auVar106 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar74 + 0x1b18);
      auVar93 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar74 + 0x1f9c);
      auVar108 = vfmadd213ps_avx512vl(auVar109,local_560,auVar94);
      auVar217._0_4_ = fVar158 * auVar93._0_4_;
      auVar217._4_4_ = fVar158 * auVar93._4_4_;
      auVar217._8_4_ = fVar158 * auVar93._8_4_;
      auVar217._12_4_ = fVar158 * auVar93._12_4_;
      auVar217._16_4_ = fVar158 * auVar93._16_4_;
      auVar217._20_4_ = fVar158 * auVar93._20_4_;
      auVar217._24_4_ = fVar158 * auVar93._24_4_;
      auVar217._28_4_ = 0;
      auVar109 = vmulps_avx512vl(_local_500,auVar93);
      auVar93 = vmulps_avx512vl(local_260,auVar93);
      auVar94 = vfmadd231ps_avx512vl(auVar217,auVar106,local_4a0);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar106,local_4c0);
      auVar106 = vfmadd231ps_avx512vl(auVar93,auVar100,auVar106);
      auVar93 = vfmadd231ps_avx512vl(auVar94,auVar107,local_460);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar107,local_480);
      auVar94 = vfmadd231ps_avx512vl(auVar106,local_580,auVar107);
      auVar85 = vfmadd231ps_fma(auVar93,auVar110,local_420);
      auVar93 = vfmadd231ps_avx512vl(auVar109,auVar110,local_440);
      auVar109 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar74 + 0x1210);
      auVar107 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar74 + 0x1b18);
      auVar106 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar74 + 0x1f9c);
      auVar105 = vfmadd231ps_avx512vl(auVar94,local_560,auVar110);
      auVar94._4_4_ = fVar158 * auVar106._4_4_;
      auVar94._0_4_ = fVar158 * auVar106._0_4_;
      auVar94._8_4_ = fVar158 * auVar106._8_4_;
      auVar94._12_4_ = fVar158 * auVar106._12_4_;
      auVar94._16_4_ = fVar158 * auVar106._16_4_;
      auVar94._20_4_ = fVar158 * auVar106._20_4_;
      auVar94._24_4_ = fVar158 * auVar106._24_4_;
      auVar94._28_4_ = auVar110._28_4_;
      auVar110 = vmulps_avx512vl(_local_500,auVar106);
      auVar106 = vmulps_avx512vl(local_260,auVar106);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar107,local_4a0);
      auVar95 = vfmadd231ps_avx512vl(auVar110,auVar107,local_4c0);
      auVar107 = vfmadd231ps_avx512vl(auVar106,auVar100,auVar107);
      auVar110 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar74 + 0x1694);
      auVar106 = vfmadd231ps_avx512vl(auVar94,auVar110,local_460);
      auVar94 = vfmadd231ps_avx512vl(auVar95,auVar110,local_480);
      auVar110 = vfmadd231ps_avx512vl(auVar107,local_580,auVar110);
      auVar81 = vfmadd231ps_fma(auVar106,auVar109,local_420);
      auVar107 = vfmadd231ps_avx512vl(auVar94,auVar109,local_440);
      auVar106 = vfmadd231ps_avx512vl(auVar110,local_560,auVar109);
      auVar225._8_4_ = 0x7fffffff;
      auVar225._0_8_ = 0x7fffffff7fffffff;
      auVar225._12_4_ = 0x7fffffff;
      auVar225._16_4_ = 0x7fffffff;
      auVar225._20_4_ = 0x7fffffff;
      auVar225._24_4_ = 0x7fffffff;
      auVar225._28_4_ = 0x7fffffff;
      auVar109 = vandps_avx(ZEXT1632(auVar85),auVar225);
      auVar110 = vandps_avx(auVar93,auVar225);
      auVar110 = vmaxps_avx(auVar109,auVar110);
      auVar109 = vandps_avx(auVar105,auVar225);
      auVar109 = vmaxps_avx(auVar110,auVar109);
      auVar221._4_4_ = fVar166;
      auVar221._0_4_ = fVar166;
      auVar221._8_4_ = fVar166;
      auVar221._12_4_ = fVar166;
      auVar221._16_4_ = fVar166;
      auVar221._20_4_ = fVar166;
      auVar221._24_4_ = fVar166;
      auVar221._28_4_ = fVar166;
      uVar70 = vcmpps_avx512vl(auVar109,auVar221,1);
      bVar13 = (bool)((byte)uVar70 & 1);
      auVar111._0_4_ = (float)((uint)bVar13 * auVar98._0_4_ | (uint)!bVar13 * auVar85._0_4_);
      bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar111._4_4_ = (float)((uint)bVar13 * auVar98._4_4_ | (uint)!bVar13 * auVar85._4_4_);
      bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar111._8_4_ = (float)((uint)bVar13 * auVar98._8_4_ | (uint)!bVar13 * auVar85._8_4_);
      bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar111._12_4_ = (float)((uint)bVar13 * auVar98._12_4_ | (uint)!bVar13 * auVar85._12_4_);
      fVar159 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar98._16_4_);
      auVar111._16_4_ = fVar159;
      fVar158 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar98._20_4_);
      auVar111._20_4_ = fVar158;
      fVar160 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar98._24_4_);
      auVar111._24_4_ = fVar160;
      uVar77 = (uint)(byte)(uVar70 >> 7) * auVar98._28_4_;
      auVar111._28_4_ = uVar77;
      bVar13 = (bool)((byte)uVar70 & 1);
      auVar112._0_4_ = (float)((uint)bVar13 * auVar99._0_4_ | (uint)!bVar13 * auVar93._0_4_);
      bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar112._4_4_ = (float)((uint)bVar13 * auVar99._4_4_ | (uint)!bVar13 * auVar93._4_4_);
      bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar112._8_4_ = (float)((uint)bVar13 * auVar99._8_4_ | (uint)!bVar13 * auVar93._8_4_);
      bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar112._12_4_ = (float)((uint)bVar13 * auVar99._12_4_ | (uint)!bVar13 * auVar93._12_4_);
      bVar13 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar112._16_4_ = (float)((uint)bVar13 * auVar99._16_4_ | (uint)!bVar13 * auVar93._16_4_);
      bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar112._20_4_ = (float)((uint)bVar13 * auVar99._20_4_ | (uint)!bVar13 * auVar93._20_4_);
      bVar13 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar112._24_4_ = (float)((uint)bVar13 * auVar99._24_4_ | (uint)!bVar13 * auVar93._24_4_);
      bVar13 = SUB81(uVar70 >> 7,0);
      auVar112._28_4_ = (uint)bVar13 * auVar99._28_4_ | (uint)!bVar13 * auVar93._28_4_;
      auVar109 = vandps_avx(auVar225,ZEXT1632(auVar81));
      auVar110 = vandps_avx(auVar107,auVar225);
      auVar110 = vmaxps_avx(auVar109,auVar110);
      auVar109 = vandps_avx(auVar106,auVar225);
      auVar109 = vmaxps_avx(auVar110,auVar109);
      uVar70 = vcmpps_avx512vl(auVar109,auVar221,1);
      bVar13 = (bool)((byte)uVar70 & 1);
      auVar113._0_4_ = (float)((uint)bVar13 * auVar98._0_4_ | (uint)!bVar13 * auVar81._0_4_);
      bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar113._4_4_ = (float)((uint)bVar13 * auVar98._4_4_ | (uint)!bVar13 * auVar81._4_4_);
      bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar113._8_4_ = (float)((uint)bVar13 * auVar98._8_4_ | (uint)!bVar13 * auVar81._8_4_);
      bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar113._12_4_ = (float)((uint)bVar13 * auVar98._12_4_ | (uint)!bVar13 * auVar81._12_4_);
      fVar173 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar98._16_4_);
      auVar113._16_4_ = fVar173;
      fVar172 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar98._20_4_);
      auVar113._20_4_ = fVar172;
      fVar190 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar98._24_4_);
      auVar113._24_4_ = fVar190;
      auVar113._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar98._28_4_;
      bVar13 = (bool)((byte)uVar70 & 1);
      auVar114._0_4_ = (float)((uint)bVar13 * auVar99._0_4_ | (uint)!bVar13 * auVar107._0_4_);
      bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar114._4_4_ = (float)((uint)bVar13 * auVar99._4_4_ | (uint)!bVar13 * auVar107._4_4_);
      bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar114._8_4_ = (float)((uint)bVar13 * auVar99._8_4_ | (uint)!bVar13 * auVar107._8_4_);
      bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar114._12_4_ = (float)((uint)bVar13 * auVar99._12_4_ | (uint)!bVar13 * auVar107._12_4_);
      bVar13 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar114._16_4_ = (float)((uint)bVar13 * auVar99._16_4_ | (uint)!bVar13 * auVar107._16_4_);
      bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar114._20_4_ = (float)((uint)bVar13 * auVar99._20_4_ | (uint)!bVar13 * auVar107._20_4_);
      bVar13 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar114._24_4_ = (float)((uint)bVar13 * auVar99._24_4_ | (uint)!bVar13 * auVar107._24_4_);
      bVar13 = SUB81(uVar70 >> 7,0);
      auVar114._28_4_ = (uint)bVar13 * auVar99._28_4_ | (uint)!bVar13 * auVar107._28_4_;
      auVar92 = vxorps_avx512vl(auVar162,auVar162);
      auVar109 = vfmadd213ps_avx512vl(auVar111,auVar111,ZEXT1632(auVar92));
      auVar85 = vfmadd231ps_fma(auVar109,auVar112,auVar112);
      auVar107 = vrsqrt14ps_avx512vl(ZEXT1632(auVar85));
      fVar79 = auVar107._0_4_;
      fVar80 = auVar107._4_4_;
      fVar136 = auVar107._8_4_;
      fVar137 = auVar107._12_4_;
      fVar138 = auVar107._16_4_;
      fVar139 = auVar107._20_4_;
      fVar140 = auVar107._24_4_;
      auVar109._4_4_ = fVar80 * fVar80 * fVar80 * auVar85._4_4_ * -0.5;
      auVar109._0_4_ = fVar79 * fVar79 * fVar79 * auVar85._0_4_ * -0.5;
      auVar109._8_4_ = fVar136 * fVar136 * fVar136 * auVar85._8_4_ * -0.5;
      auVar109._12_4_ = fVar137 * fVar137 * fVar137 * auVar85._12_4_ * -0.5;
      auVar109._16_4_ = fVar138 * fVar138 * fVar138 * -0.0;
      auVar109._20_4_ = fVar139 * fVar139 * fVar139 * -0.0;
      auVar109._24_4_ = fVar140 * fVar140 * fVar140 * -0.0;
      auVar109._28_4_ = 0;
      auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar93,auVar107);
      auVar110._4_4_ = auVar112._4_4_ * auVar109._4_4_;
      auVar110._0_4_ = auVar112._0_4_ * auVar109._0_4_;
      auVar110._8_4_ = auVar112._8_4_ * auVar109._8_4_;
      auVar110._12_4_ = auVar112._12_4_ * auVar109._12_4_;
      auVar110._16_4_ = auVar112._16_4_ * auVar109._16_4_;
      auVar110._20_4_ = auVar112._20_4_ * auVar109._20_4_;
      auVar110._24_4_ = auVar112._24_4_ * auVar109._24_4_;
      auVar110._28_4_ = auVar107._28_4_;
      auVar107._4_4_ = auVar109._4_4_ * -auVar111._4_4_;
      auVar107._0_4_ = auVar109._0_4_ * -auVar111._0_4_;
      auVar107._8_4_ = auVar109._8_4_ * -auVar111._8_4_;
      auVar107._12_4_ = auVar109._12_4_ * -auVar111._12_4_;
      auVar107._16_4_ = auVar109._16_4_ * -fVar159;
      auVar107._20_4_ = auVar109._20_4_ * -fVar158;
      auVar107._24_4_ = auVar109._24_4_ * -fVar160;
      auVar107._28_4_ = uVar77 ^ 0x80000000;
      auVar94 = vmulps_avx512vl(auVar109,ZEXT1632(auVar92));
      auVar98 = ZEXT1632(auVar92);
      auVar106 = vfmadd213ps_avx512vl(auVar113,auVar113,auVar98);
      auVar85 = vfmadd231ps_fma(auVar106,auVar114,auVar114);
      auVar95 = vrsqrt14ps_avx512vl(ZEXT1632(auVar85));
      fVar158 = auVar95._0_4_;
      fVar159 = auVar95._4_4_;
      fVar160 = auVar95._8_4_;
      fVar79 = auVar95._12_4_;
      fVar80 = auVar95._16_4_;
      fVar136 = auVar95._20_4_;
      fVar137 = auVar95._24_4_;
      auVar106._4_4_ = fVar159 * fVar159 * fVar159 * auVar85._4_4_ * -0.5;
      auVar106._0_4_ = fVar158 * fVar158 * fVar158 * auVar85._0_4_ * -0.5;
      auVar106._8_4_ = fVar160 * fVar160 * fVar160 * auVar85._8_4_ * -0.5;
      auVar106._12_4_ = fVar79 * fVar79 * fVar79 * auVar85._12_4_ * -0.5;
      auVar106._16_4_ = fVar80 * fVar80 * fVar80 * -0.0;
      auVar106._20_4_ = fVar136 * fVar136 * fVar136 * -0.0;
      auVar106._24_4_ = fVar137 * fVar137 * fVar137 * -0.0;
      auVar106._28_4_ = 0;
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar93,auVar95);
      auVar105._4_4_ = auVar114._4_4_ * auVar106._4_4_;
      auVar105._0_4_ = auVar114._0_4_ * auVar106._0_4_;
      auVar105._8_4_ = auVar114._8_4_ * auVar106._8_4_;
      auVar105._12_4_ = auVar114._12_4_ * auVar106._12_4_;
      auVar105._16_4_ = auVar114._16_4_ * auVar106._16_4_;
      auVar105._20_4_ = auVar114._20_4_ * auVar106._20_4_;
      auVar105._24_4_ = auVar114._24_4_ * auVar106._24_4_;
      auVar105._28_4_ = auVar95._28_4_;
      auVar95._4_4_ = -auVar113._4_4_ * auVar106._4_4_;
      auVar95._0_4_ = -auVar113._0_4_ * auVar106._0_4_;
      auVar95._8_4_ = -auVar113._8_4_ * auVar106._8_4_;
      auVar95._12_4_ = -auVar113._12_4_ * auVar106._12_4_;
      auVar95._16_4_ = -fVar173 * auVar106._16_4_;
      auVar95._20_4_ = -fVar172 * auVar106._20_4_;
      auVar95._24_4_ = -fVar190 * auVar106._24_4_;
      auVar95._28_4_ = auVar109._28_4_;
      auVar109 = vmulps_avx512vl(auVar106,auVar98);
      auVar85 = vfmadd213ps_fma(auVar110,auVar101,auVar96);
      auVar81 = vfmadd213ps_fma(auVar107,auVar101,auVar97);
      auVar106 = vfmadd213ps_avx512vl(auVar94,auVar101,auVar108);
      auVar93 = vfmadd213ps_avx512vl(auVar105,auVar102,ZEXT1632(auVar86));
      auVar88 = vfnmadd213ps_fma(auVar110,auVar101,auVar96);
      auVar91 = vfmadd213ps_fma(auVar95,auVar102,ZEXT1632(auVar87));
      auVar145 = vfnmadd213ps_fma(auVar107,auVar101,auVar97);
      auVar90 = vfmadd213ps_fma(auVar109,auVar102,auVar103);
      auVar110 = vfnmadd231ps_avx512vl(auVar108,auVar101,auVar94);
      auVar146 = vfnmadd213ps_fma(auVar105,auVar102,ZEXT1632(auVar86));
      auVar89 = vfnmadd213ps_fma(auVar95,auVar102,ZEXT1632(auVar87));
      auVar161 = vfnmadd231ps_fma(auVar103,auVar102,auVar109);
      auVar107 = vsubps_avx512vl(auVar93,ZEXT1632(auVar88));
      auVar109 = vsubps_avx(ZEXT1632(auVar91),ZEXT1632(auVar145));
      auVar94 = vsubps_avx512vl(ZEXT1632(auVar90),auVar110);
      auVar105 = vmulps_avx512vl(auVar109,auVar110);
      auVar86 = vfmsub231ps_fma(auVar105,ZEXT1632(auVar145),auVar94);
      auVar96._4_4_ = auVar88._4_4_ * auVar94._4_4_;
      auVar96._0_4_ = auVar88._0_4_ * auVar94._0_4_;
      auVar96._8_4_ = auVar88._8_4_ * auVar94._8_4_;
      auVar96._12_4_ = auVar88._12_4_ * auVar94._12_4_;
      auVar96._16_4_ = auVar94._16_4_ * 0.0;
      auVar96._20_4_ = auVar94._20_4_ * 0.0;
      auVar96._24_4_ = auVar94._24_4_ * 0.0;
      auVar96._28_4_ = auVar94._28_4_;
      auVar94 = vfmsub231ps_avx512vl(auVar96,auVar110,auVar107);
      auVar97._4_4_ = auVar145._4_4_ * auVar107._4_4_;
      auVar97._0_4_ = auVar145._0_4_ * auVar107._0_4_;
      auVar97._8_4_ = auVar145._8_4_ * auVar107._8_4_;
      auVar97._12_4_ = auVar145._12_4_ * auVar107._12_4_;
      auVar97._16_4_ = auVar107._16_4_ * 0.0;
      auVar97._20_4_ = auVar107._20_4_ * 0.0;
      auVar97._24_4_ = auVar107._24_4_ * 0.0;
      auVar97._28_4_ = auVar107._28_4_;
      auVar87 = vfmsub231ps_fma(auVar97,ZEXT1632(auVar88),auVar109);
      auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar98,auVar94);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar98,ZEXT1632(auVar86));
      auVar103 = ZEXT1632(auVar92);
      uVar70 = vcmpps_avx512vl(auVar109,auVar103,2);
      bVar69 = (byte)uVar70;
      fVar79 = (float)((uint)(bVar69 & 1) * auVar85._0_4_ |
                      (uint)!(bool)(bVar69 & 1) * auVar146._0_4_);
      bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
      fVar136 = (float)((uint)bVar13 * auVar85._4_4_ | (uint)!bVar13 * auVar146._4_4_);
      bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
      fVar138 = (float)((uint)bVar13 * auVar85._8_4_ | (uint)!bVar13 * auVar146._8_4_);
      bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
      fVar140 = (float)((uint)bVar13 * auVar85._12_4_ | (uint)!bVar13 * auVar146._12_4_);
      auVar105 = ZEXT1632(CONCAT412(fVar140,CONCAT48(fVar138,CONCAT44(fVar136,fVar79))));
      fVar80 = (float)((uint)(bVar69 & 1) * auVar81._0_4_ |
                      (uint)!(bool)(bVar69 & 1) * auVar89._0_4_);
      bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
      fVar137 = (float)((uint)bVar13 * auVar81._4_4_ | (uint)!bVar13 * auVar89._4_4_);
      bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
      fVar139 = (float)((uint)bVar13 * auVar81._8_4_ | (uint)!bVar13 * auVar89._8_4_);
      bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
      fVar141 = (float)((uint)bVar13 * auVar81._12_4_ | (uint)!bVar13 * auVar89._12_4_);
      auVar95 = ZEXT1632(CONCAT412(fVar141,CONCAT48(fVar139,CONCAT44(fVar137,fVar80))));
      auVar115._0_4_ =
           (float)((uint)(bVar69 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar161._0_4_)
      ;
      bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar115._4_4_ = (float)((uint)bVar13 * auVar106._4_4_ | (uint)!bVar13 * auVar161._4_4_);
      bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar115._8_4_ = (float)((uint)bVar13 * auVar106._8_4_ | (uint)!bVar13 * auVar161._8_4_);
      bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar115._12_4_ = (float)((uint)bVar13 * auVar106._12_4_ | (uint)!bVar13 * auVar161._12_4_);
      fVar158 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar106._16_4_);
      auVar115._16_4_ = fVar158;
      fVar159 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar106._20_4_);
      auVar115._20_4_ = fVar159;
      fVar160 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar106._24_4_);
      auVar115._24_4_ = fVar160;
      iVar1 = (uint)(byte)(uVar70 >> 7) * auVar106._28_4_;
      auVar115._28_4_ = iVar1;
      auVar107 = vblendmps_avx512vl(ZEXT1632(auVar88),auVar93);
      auVar116._0_4_ =
           (uint)(bVar69 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar81._0_4_;
      bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar116._4_4_ = (uint)bVar13 * auVar107._4_4_ | (uint)!bVar13 * auVar81._4_4_;
      bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar116._8_4_ = (uint)bVar13 * auVar107._8_4_ | (uint)!bVar13 * auVar81._8_4_;
      bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar116._12_4_ = (uint)bVar13 * auVar107._12_4_ | (uint)!bVar13 * auVar81._12_4_;
      auVar116._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * auVar107._16_4_;
      auVar116._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * auVar107._20_4_;
      auVar116._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * auVar107._24_4_;
      auVar116._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar107._28_4_;
      auVar107 = vblendmps_avx512vl(ZEXT1632(auVar145),ZEXT1632(auVar91));
      auVar117._0_4_ =
           (float)((uint)(bVar69 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar86._0_4_);
      bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar117._4_4_ = (float)((uint)bVar13 * auVar107._4_4_ | (uint)!bVar13 * auVar86._4_4_);
      bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar117._8_4_ = (float)((uint)bVar13 * auVar107._8_4_ | (uint)!bVar13 * auVar86._8_4_);
      bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar117._12_4_ = (float)((uint)bVar13 * auVar107._12_4_ | (uint)!bVar13 * auVar86._12_4_);
      fVar190 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar107._16_4_);
      auVar117._16_4_ = fVar190;
      fVar173 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar107._20_4_);
      auVar117._20_4_ = fVar173;
      fVar172 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar107._24_4_);
      auVar117._24_4_ = fVar172;
      auVar117._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar107._28_4_;
      auVar107 = vblendmps_avx512vl(auVar110,ZEXT1632(auVar90));
      auVar118._0_4_ =
           (float)((uint)(bVar69 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar106._0_4_)
      ;
      bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar118._4_4_ = (float)((uint)bVar13 * auVar107._4_4_ | (uint)!bVar13 * auVar106._4_4_);
      bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar118._8_4_ = (float)((uint)bVar13 * auVar107._8_4_ | (uint)!bVar13 * auVar106._8_4_);
      bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar118._12_4_ = (float)((uint)bVar13 * auVar107._12_4_ | (uint)!bVar13 * auVar106._12_4_);
      bVar13 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar118._16_4_ = (float)((uint)bVar13 * auVar107._16_4_ | (uint)!bVar13 * auVar106._16_4_);
      bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar118._20_4_ = (float)((uint)bVar13 * auVar107._20_4_ | (uint)!bVar13 * auVar106._20_4_);
      bVar13 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar118._24_4_ = (float)((uint)bVar13 * auVar107._24_4_ | (uint)!bVar13 * auVar106._24_4_);
      bVar13 = SUB81(uVar70 >> 7,0);
      auVar118._28_4_ = (uint)bVar13 * auVar107._28_4_ | (uint)!bVar13 * auVar106._28_4_;
      auVar119._0_4_ =
           (uint)(bVar69 & 1) * (int)auVar88._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar93._0_4_;
      bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar119._4_4_ = (uint)bVar13 * (int)auVar88._4_4_ | (uint)!bVar13 * auVar93._4_4_;
      bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar119._8_4_ = (uint)bVar13 * (int)auVar88._8_4_ | (uint)!bVar13 * auVar93._8_4_;
      bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar119._12_4_ = (uint)bVar13 * (int)auVar88._12_4_ | (uint)!bVar13 * auVar93._12_4_;
      auVar119._16_4_ = (uint)!(bool)((byte)(uVar70 >> 4) & 1) * auVar93._16_4_;
      auVar119._20_4_ = (uint)!(bool)((byte)(uVar70 >> 5) & 1) * auVar93._20_4_;
      auVar119._24_4_ = (uint)!(bool)((byte)(uVar70 >> 6) & 1) * auVar93._24_4_;
      auVar119._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar93._28_4_;
      bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
      bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
      bVar16 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar120._0_4_ =
           (uint)(bVar69 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar90._0_4_;
      bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar120._4_4_ = (uint)bVar14 * auVar110._4_4_ | (uint)!bVar14 * auVar90._4_4_;
      bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar120._8_4_ = (uint)bVar14 * auVar110._8_4_ | (uint)!bVar14 * auVar90._8_4_;
      bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar120._12_4_ = (uint)bVar14 * auVar110._12_4_ | (uint)!bVar14 * auVar90._12_4_;
      auVar120._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * auVar110._16_4_;
      auVar120._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * auVar110._20_4_;
      auVar120._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * auVar110._24_4_;
      iVar2 = (uint)(byte)(uVar70 >> 7) * auVar110._28_4_;
      auVar120._28_4_ = iVar2;
      auVar96 = vsubps_avx512vl(auVar119,auVar105);
      auVar110 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar145._12_4_ |
                                               (uint)!bVar16 * auVar91._12_4_,
                                               CONCAT48((uint)bVar15 * (int)auVar145._8_4_ |
                                                        (uint)!bVar15 * auVar91._8_4_,
                                                        CONCAT44((uint)bVar13 * (int)auVar145._4_4_
                                                                 | (uint)!bVar13 * auVar91._4_4_,
                                                                 (uint)(bVar69 & 1) *
                                                                 (int)auVar145._0_4_ |
                                                                 (uint)!(bool)(bVar69 & 1) *
                                                                 auVar91._0_4_)))),auVar95);
      auVar209 = ZEXT3264(auVar110);
      auVar107 = vsubps_avx(auVar120,auVar115);
      auVar106 = vsubps_avx(auVar105,auVar116);
      auVar213 = ZEXT3264(auVar106);
      auVar93 = vsubps_avx(auVar95,auVar117);
      auVar94 = vsubps_avx(auVar115,auVar118);
      auVar98._4_4_ = auVar107._4_4_ * fVar136;
      auVar98._0_4_ = auVar107._0_4_ * fVar79;
      auVar98._8_4_ = auVar107._8_4_ * fVar138;
      auVar98._12_4_ = auVar107._12_4_ * fVar140;
      auVar98._16_4_ = auVar107._16_4_ * 0.0;
      auVar98._20_4_ = auVar107._20_4_ * 0.0;
      auVar98._24_4_ = auVar107._24_4_ * 0.0;
      auVar98._28_4_ = iVar2;
      auVar85 = vfmsub231ps_fma(auVar98,auVar115,auVar96);
      auVar99._4_4_ = fVar137 * auVar96._4_4_;
      auVar99._0_4_ = fVar80 * auVar96._0_4_;
      auVar99._8_4_ = fVar139 * auVar96._8_4_;
      auVar99._12_4_ = fVar141 * auVar96._12_4_;
      auVar99._16_4_ = auVar96._16_4_ * 0.0;
      auVar99._20_4_ = auVar96._20_4_ * 0.0;
      auVar99._24_4_ = auVar96._24_4_ * 0.0;
      auVar99._28_4_ = auVar109._28_4_;
      auVar81 = vfmsub231ps_fma(auVar99,auVar105,auVar110);
      auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar103,ZEXT1632(auVar85));
      auVar193._0_4_ = auVar110._0_4_ * auVar115._0_4_;
      auVar193._4_4_ = auVar110._4_4_ * auVar115._4_4_;
      auVar193._8_4_ = auVar110._8_4_ * auVar115._8_4_;
      auVar193._12_4_ = auVar110._12_4_ * auVar115._12_4_;
      auVar193._16_4_ = auVar110._16_4_ * fVar158;
      auVar193._20_4_ = auVar110._20_4_ * fVar159;
      auVar193._24_4_ = auVar110._24_4_ * fVar160;
      auVar193._28_4_ = 0;
      auVar85 = vfmsub231ps_fma(auVar193,auVar95,auVar107);
      auVar97 = vfmadd231ps_avx512vl(auVar109,auVar103,ZEXT1632(auVar85));
      auVar109 = vmulps_avx512vl(auVar94,auVar116);
      auVar109 = vfmsub231ps_avx512vl(auVar109,auVar106,auVar118);
      auVar108._4_4_ = auVar93._4_4_ * auVar118._4_4_;
      auVar108._0_4_ = auVar93._0_4_ * auVar118._0_4_;
      auVar108._8_4_ = auVar93._8_4_ * auVar118._8_4_;
      auVar108._12_4_ = auVar93._12_4_ * auVar118._12_4_;
      auVar108._16_4_ = auVar93._16_4_ * auVar118._16_4_;
      auVar108._20_4_ = auVar93._20_4_ * auVar118._20_4_;
      auVar108._24_4_ = auVar93._24_4_ * auVar118._24_4_;
      auVar108._28_4_ = auVar118._28_4_;
      auVar85 = vfmsub231ps_fma(auVar108,auVar117,auVar94);
      auVar194._0_4_ = auVar117._0_4_ * auVar106._0_4_;
      auVar194._4_4_ = auVar117._4_4_ * auVar106._4_4_;
      auVar194._8_4_ = auVar117._8_4_ * auVar106._8_4_;
      auVar194._12_4_ = auVar117._12_4_ * auVar106._12_4_;
      auVar194._16_4_ = fVar190 * auVar106._16_4_;
      auVar194._20_4_ = fVar173 * auVar106._20_4_;
      auVar194._24_4_ = fVar172 * auVar106._24_4_;
      auVar194._28_4_ = 0;
      auVar81 = vfmsub231ps_fma(auVar194,auVar93,auVar116);
      auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar103,auVar109);
      auVar98 = vfmadd231ps_avx512vl(auVar109,auVar103,ZEXT1632(auVar85));
      auVar198 = ZEXT3264(auVar98);
      auVar109 = vmaxps_avx(auVar97,auVar98);
      uVar24 = vcmpps_avx512vl(auVar109,auVar103,2);
      bVar78 = bVar78 & (byte)uVar24;
      if (bVar78 != 0) {
        auVar35._4_4_ = auVar94._4_4_ * auVar110._4_4_;
        auVar35._0_4_ = auVar94._0_4_ * auVar110._0_4_;
        auVar35._8_4_ = auVar94._8_4_ * auVar110._8_4_;
        auVar35._12_4_ = auVar94._12_4_ * auVar110._12_4_;
        auVar35._16_4_ = auVar94._16_4_ * auVar110._16_4_;
        auVar35._20_4_ = auVar94._20_4_ * auVar110._20_4_;
        auVar35._24_4_ = auVar94._24_4_ * auVar110._24_4_;
        auVar35._28_4_ = auVar109._28_4_;
        auVar86 = vfmsub231ps_fma(auVar35,auVar93,auVar107);
        auVar36._4_4_ = auVar107._4_4_ * auVar106._4_4_;
        auVar36._0_4_ = auVar107._0_4_ * auVar106._0_4_;
        auVar36._8_4_ = auVar107._8_4_ * auVar106._8_4_;
        auVar36._12_4_ = auVar107._12_4_ * auVar106._12_4_;
        auVar36._16_4_ = auVar107._16_4_ * auVar106._16_4_;
        auVar36._20_4_ = auVar107._20_4_ * auVar106._20_4_;
        auVar36._24_4_ = auVar107._24_4_ * auVar106._24_4_;
        auVar36._28_4_ = auVar107._28_4_;
        auVar91 = vfmsub231ps_fma(auVar36,auVar96,auVar94);
        auVar37._4_4_ = auVar93._4_4_ * auVar96._4_4_;
        auVar37._0_4_ = auVar93._0_4_ * auVar96._0_4_;
        auVar37._8_4_ = auVar93._8_4_ * auVar96._8_4_;
        auVar37._12_4_ = auVar93._12_4_ * auVar96._12_4_;
        auVar37._16_4_ = auVar93._16_4_ * auVar96._16_4_;
        auVar37._20_4_ = auVar93._20_4_ * auVar96._20_4_;
        auVar37._24_4_ = auVar93._24_4_ * auVar96._24_4_;
        auVar37._28_4_ = auVar93._28_4_;
        auVar87 = vfmsub231ps_fma(auVar37,auVar106,auVar110);
        auVar85 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar91),ZEXT1632(auVar87));
        auVar81 = vfmadd231ps_fma(ZEXT1632(auVar85),ZEXT1632(auVar86),ZEXT1232(ZEXT412(0)) << 0x20);
        auVar109 = vrcp14ps_avx512vl(ZEXT1632(auVar81));
        auVar213 = ZEXT3264(auVar109);
        auVar29._8_4_ = 0x3f800000;
        auVar29._0_8_ = 0x3f8000003f800000;
        auVar29._12_4_ = 0x3f800000;
        auVar29._16_4_ = 0x3f800000;
        auVar29._20_4_ = 0x3f800000;
        auVar29._24_4_ = 0x3f800000;
        auVar29._28_4_ = 0x3f800000;
        auVar110 = vfnmadd213ps_avx512vl(auVar109,ZEXT1632(auVar81),auVar29);
        auVar85 = vfmadd132ps_fma(auVar110,auVar109,auVar109);
        auVar209 = ZEXT1664(auVar85);
        auVar38._4_4_ = auVar87._4_4_ * auVar115._4_4_;
        auVar38._0_4_ = auVar87._0_4_ * auVar115._0_4_;
        auVar38._8_4_ = auVar87._8_4_ * auVar115._8_4_;
        auVar38._12_4_ = auVar87._12_4_ * auVar115._12_4_;
        auVar38._16_4_ = fVar158 * 0.0;
        auVar38._20_4_ = fVar159 * 0.0;
        auVar38._24_4_ = fVar160 * 0.0;
        auVar38._28_4_ = iVar1;
        auVar91 = vfmadd231ps_fma(auVar38,auVar95,ZEXT1632(auVar91));
        auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar105,ZEXT1632(auVar86));
        fVar158 = auVar85._0_4_;
        fVar159 = auVar85._4_4_;
        fVar160 = auVar85._8_4_;
        fVar173 = auVar85._12_4_;
        local_3c0 = ZEXT1632(CONCAT412(auVar91._12_4_ * fVar173,
                                       CONCAT48(auVar91._8_4_ * fVar160,
                                                CONCAT44(auVar91._4_4_ * fVar159,
                                                         auVar91._0_4_ * fVar158))));
        auVar220 = ZEXT3264(local_3c0);
        auVar150._4_4_ = local_520;
        auVar150._0_4_ = local_520;
        auVar150._8_4_ = local_520;
        auVar150._12_4_ = local_520;
        auVar150._16_4_ = local_520;
        auVar150._20_4_ = local_520;
        auVar150._24_4_ = local_520;
        auVar150._28_4_ = local_520;
        uVar24 = vcmpps_avx512vl(auVar150,local_3c0,2);
        uVar144 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar30._4_4_ = uVar144;
        auVar30._0_4_ = uVar144;
        auVar30._8_4_ = uVar144;
        auVar30._12_4_ = uVar144;
        auVar30._16_4_ = uVar144;
        auVar30._20_4_ = uVar144;
        auVar30._24_4_ = uVar144;
        auVar30._28_4_ = uVar144;
        uVar25 = vcmpps_avx512vl(local_3c0,auVar30,2);
        bVar78 = (byte)uVar24 & (byte)uVar25 & bVar78;
        if (bVar78 != 0) {
          uVar76 = vcmpps_avx512vl(ZEXT1632(auVar81),ZEXT1232(ZEXT412(0)) << 0x20,4);
          uVar76 = bVar78 & uVar76;
          if ((char)uVar76 != '\0') {
            fVar172 = auVar97._0_4_ * fVar158;
            fVar190 = auVar97._4_4_ * fVar159;
            auVar39._4_4_ = fVar190;
            auVar39._0_4_ = fVar172;
            fVar79 = auVar97._8_4_ * fVar160;
            auVar39._8_4_ = fVar79;
            fVar80 = auVar97._12_4_ * fVar173;
            auVar39._12_4_ = fVar80;
            fVar136 = auVar97._16_4_ * 0.0;
            auVar39._16_4_ = fVar136;
            fVar137 = auVar97._20_4_ * 0.0;
            auVar39._20_4_ = fVar137;
            fVar138 = auVar97._24_4_ * 0.0;
            auVar39._24_4_ = fVar138;
            auVar39._28_4_ = auVar97._28_4_;
            auVar151._8_4_ = 0x3f800000;
            auVar151._0_8_ = 0x3f8000003f800000;
            auVar151._12_4_ = 0x3f800000;
            auVar151._16_4_ = 0x3f800000;
            auVar151._20_4_ = 0x3f800000;
            auVar151._24_4_ = 0x3f800000;
            auVar151._28_4_ = 0x3f800000;
            auVar109 = vsubps_avx(auVar151,auVar39);
            local_400._0_4_ =
                 (float)((uint)(bVar69 & 1) * (int)fVar172 |
                        (uint)!(bool)(bVar69 & 1) * auVar109._0_4_);
            bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
            local_400._4_4_ = (float)((uint)bVar13 * (int)fVar190 | (uint)!bVar13 * auVar109._4_4_);
            bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
            local_400._8_4_ = (float)((uint)bVar13 * (int)fVar79 | (uint)!bVar13 * auVar109._8_4_);
            bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
            local_400._12_4_ = (float)((uint)bVar13 * (int)fVar80 | (uint)!bVar13 * auVar109._12_4_)
            ;
            bVar13 = (bool)((byte)(uVar70 >> 4) & 1);
            local_400._16_4_ =
                 (float)((uint)bVar13 * (int)fVar136 | (uint)!bVar13 * auVar109._16_4_);
            bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
            local_400._20_4_ =
                 (float)((uint)bVar13 * (int)fVar137 | (uint)!bVar13 * auVar109._20_4_);
            bVar13 = (bool)((byte)(uVar70 >> 6) & 1);
            local_400._24_4_ =
                 (float)((uint)bVar13 * (int)fVar138 | (uint)!bVar13 * auVar109._24_4_);
            bVar13 = SUB81(uVar70 >> 7,0);
            local_400._28_4_ =
                 (float)((uint)bVar13 * auVar97._28_4_ | (uint)!bVar13 * auVar109._28_4_);
            auVar109 = vsubps_avx(auVar102,auVar101);
            auVar85 = vfmadd213ps_fma(auVar109,local_400,auVar101);
            uVar144 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
            auVar101._4_4_ = uVar144;
            auVar101._0_4_ = uVar144;
            auVar101._8_4_ = uVar144;
            auVar101._12_4_ = uVar144;
            auVar101._16_4_ = uVar144;
            auVar101._20_4_ = uVar144;
            auVar101._24_4_ = uVar144;
            auVar101._28_4_ = uVar144;
            auVar109 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar85._12_4_ + auVar85._12_4_,
                                                          CONCAT48(auVar85._8_4_ + auVar85._8_4_,
                                                                   CONCAT44(auVar85._4_4_ +
                                                                            auVar85._4_4_,
                                                                            auVar85._0_4_ +
                                                                            auVar85._0_4_)))),
                                       auVar101);
            uVar26 = vcmpps_avx512vl(local_3c0,auVar109,6);
            uVar76 = uVar76 & uVar26;
            bVar78 = (byte)uVar76;
            if (bVar78 != 0) {
              auVar170._0_4_ = auVar98._0_4_ * fVar158;
              auVar170._4_4_ = auVar98._4_4_ * fVar159;
              auVar170._8_4_ = auVar98._8_4_ * fVar160;
              auVar170._12_4_ = auVar98._12_4_ * fVar173;
              auVar170._16_4_ = auVar98._16_4_ * 0.0;
              auVar170._20_4_ = auVar98._20_4_ * 0.0;
              auVar170._24_4_ = auVar98._24_4_ * 0.0;
              auVar170._28_4_ = 0;
              auVar187._8_4_ = 0x3f800000;
              auVar187._0_8_ = 0x3f8000003f800000;
              auVar187._12_4_ = 0x3f800000;
              auVar187._16_4_ = 0x3f800000;
              auVar187._20_4_ = 0x3f800000;
              auVar187._24_4_ = 0x3f800000;
              auVar187._28_4_ = 0x3f800000;
              auVar109 = vsubps_avx(auVar187,auVar170);
              auVar121._0_4_ =
                   (uint)(bVar69 & 1) * (int)auVar170._0_4_ |
                   (uint)!(bool)(bVar69 & 1) * auVar109._0_4_;
              bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar121._4_4_ = (uint)bVar13 * (int)auVar170._4_4_ | (uint)!bVar13 * auVar109._4_4_;
              bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar121._8_4_ = (uint)bVar13 * (int)auVar170._8_4_ | (uint)!bVar13 * auVar109._8_4_;
              bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar121._12_4_ =
                   (uint)bVar13 * (int)auVar170._12_4_ | (uint)!bVar13 * auVar109._12_4_;
              bVar13 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar121._16_4_ =
                   (uint)bVar13 * (int)auVar170._16_4_ | (uint)!bVar13 * auVar109._16_4_;
              bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar121._20_4_ =
                   (uint)bVar13 * (int)auVar170._20_4_ | (uint)!bVar13 * auVar109._20_4_;
              bVar13 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar121._24_4_ =
                   (uint)bVar13 * (int)auVar170._24_4_ | (uint)!bVar13 * auVar109._24_4_;
              auVar121._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar109._28_4_;
              auVar102._8_4_ = 0x40000000;
              auVar102._0_8_ = 0x4000000040000000;
              auVar102._12_4_ = 0x40000000;
              auVar102._16_4_ = 0x40000000;
              auVar102._20_4_ = 0x40000000;
              auVar102._24_4_ = 0x40000000;
              auVar102._28_4_ = 0x40000000;
              local_3e0 = vfmsub132ps_avx512vl(auVar121,auVar187,auVar102);
              local_3a0 = 0;
              if ((pGVar73->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                fVar166 = 1.0 / auVar104._0_4_;
                local_340[0] = fVar166 * (local_400._0_4_ + 0.0);
                local_340[1] = fVar166 * (local_400._4_4_ + 1.0);
                local_340[2] = fVar166 * (local_400._8_4_ + 2.0);
                local_340[3] = fVar166 * (local_400._12_4_ + 3.0);
                fStack_330 = fVar166 * (local_400._16_4_ + 4.0);
                fStack_32c = fVar166 * (local_400._20_4_ + 5.0);
                fStack_328 = fVar166 * (local_400._24_4_ + 6.0);
                fStack_324 = local_400._28_4_ + 7.0;
                local_320 = local_3e0;
                local_300 = local_3c0;
                auVar152._8_4_ = 0x7f800000;
                auVar152._0_8_ = 0x7f8000007f800000;
                auVar152._12_4_ = 0x7f800000;
                auVar152._16_4_ = 0x7f800000;
                auVar152._20_4_ = 0x7f800000;
                auVar152._24_4_ = 0x7f800000;
                auVar152._28_4_ = 0x7f800000;
                auVar109 = vblendmps_avx512vl(auVar152,local_3c0);
                auVar122._0_4_ =
                     (uint)(bVar78 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar78 & 1) * 0x7f800000;
                bVar13 = (bool)((byte)(uVar76 >> 1) & 1);
                auVar122._4_4_ = (uint)bVar13 * auVar109._4_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = (bool)((byte)(uVar76 >> 2) & 1);
                auVar122._8_4_ = (uint)bVar13 * auVar109._8_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = (bool)((byte)(uVar76 >> 3) & 1);
                auVar122._12_4_ = (uint)bVar13 * auVar109._12_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = (bool)((byte)(uVar76 >> 4) & 1);
                auVar122._16_4_ = (uint)bVar13 * auVar109._16_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = (bool)((byte)(uVar76 >> 5) & 1);
                auVar122._20_4_ = (uint)bVar13 * auVar109._20_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = (bool)((byte)(uVar76 >> 6) & 1);
                auVar122._24_4_ = (uint)bVar13 * auVar109._24_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = SUB81(uVar76 >> 7,0);
                auVar122._28_4_ = (uint)bVar13 * auVar109._28_4_ | (uint)!bVar13 * 0x7f800000;
                auVar109 = vshufps_avx(auVar122,auVar122,0xb1);
                auVar109 = vminps_avx(auVar122,auVar109);
                auVar110 = vshufpd_avx(auVar109,auVar109,5);
                auVar109 = vminps_avx(auVar109,auVar110);
                auVar110 = vpermpd_avx2(auVar109,0x4e);
                auVar109 = vminps_avx(auVar109,auVar110);
                uVar24 = vcmpps_avx512vl(auVar122,auVar109,0);
                uVar77 = (uint)uVar76;
                if ((bVar78 & (byte)uVar24) != 0) {
                  uVar77 = (uint)(bVar78 & (byte)uVar24);
                }
                uVar71 = 0;
                for (; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x80000000) {
                  uVar71 = uVar71 + 1;
                }
                uVar70 = (ulong)uVar71;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar73->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_540 = *(float *)(ray + k * 4 + 0x100);
                  fStack_53c = 0.0;
                  fStack_538 = 0.0;
                  fStack_534 = 0.0;
                  local_5e0 = auVar100;
                  local_5c0 = local_3c0;
                  local_39c = iVar10;
                  local_390 = auVar84;
                  local_380 = uVar23;
                  uStack_378 = uVar27;
                  local_370 = uVar62;
                  uStack_368 = uVar63;
                  local_360 = uVar64;
                  uStack_358 = uVar65;
                  do {
                    fVar166 = local_340[uVar70];
                    auVar164._4_4_ = fVar166;
                    auVar164._0_4_ = fVar166;
                    auVar164._8_4_ = fVar166;
                    auVar164._12_4_ = fVar166;
                    local_1e0._16_4_ = fVar166;
                    local_1e0._0_16_ = auVar164;
                    local_1e0._20_4_ = fVar166;
                    local_1e0._24_4_ = fVar166;
                    local_1e0._28_4_ = fVar166;
                    local_1c0 = *(undefined4 *)(local_320 + uVar70 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar70 * 4);
                    local_670.context = context->user;
                    fVar158 = 1.0 - fVar166;
                    auVar86 = vfnmadd231ss_fma(ZEXT416((uint)(fVar166 * (fVar158 + fVar158))),
                                               ZEXT416((uint)fVar158),ZEXT416((uint)fVar158));
                    auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar164,
                                              ZEXT416(0xc0a00000));
                    auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar166 * fVar166 * 3.0)),
                                              ZEXT416((uint)(fVar166 + fVar166)),auVar85);
                    auVar213 = ZEXT1664(auVar81);
                    auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar164,
                                              ZEXT416(0x40000000));
                    auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar158 * fVar158 * -3.0)),
                                              ZEXT416((uint)(fVar158 + fVar158)),auVar85);
                    auVar91 = vfmadd231ss_fma(ZEXT416((uint)(fVar166 * fVar166)),auVar164,
                                              ZEXT416((uint)(fVar158 * -2.0)));
                    fVar166 = auVar86._0_4_ * 0.5;
                    fVar158 = auVar81._0_4_ * 0.5;
                    fVar159 = auVar85._0_4_ * 0.5;
                    fVar160 = auVar91._0_4_ * 0.5;
                    auVar185._0_4_ = fVar160 * local_6d0;
                    auVar185._4_4_ = fVar160 * fStack_6cc;
                    auVar185._8_4_ = fVar160 * fStack_6c8;
                    auVar185._12_4_ = fVar160 * fStack_6c4;
                    auVar205._4_4_ = fVar159;
                    auVar205._0_4_ = fVar159;
                    auVar205._8_4_ = fVar159;
                    auVar205._12_4_ = fVar159;
                    auVar85 = vfmadd132ps_fma(auVar205,auVar185,auVar147);
                    auVar186._4_4_ = fVar158;
                    auVar186._0_4_ = fVar158;
                    auVar186._8_4_ = fVar158;
                    auVar186._12_4_ = fVar158;
                    auVar85 = vfmadd132ps_fma(auVar186,auVar85,auVar20);
                    auVar149._4_4_ = fVar166;
                    auVar149._0_4_ = fVar166;
                    auVar149._8_4_ = fVar166;
                    auVar149._12_4_ = fVar166;
                    auVar85 = vfmadd213ps_fma(auVar149,auVar84,auVar85);
                    local_240 = auVar85._0_4_;
                    auVar100._8_4_ = 1;
                    auVar100._0_8_ = 0x100000001;
                    auVar100._12_4_ = 1;
                    auVar100._16_4_ = 1;
                    auVar100._20_4_ = 1;
                    auVar100._24_4_ = 1;
                    auVar100._28_4_ = 1;
                    local_220 = vpermps_avx2(auVar100,ZEXT1632(auVar85));
                    auVar198 = ZEXT3264(local_220);
                    auVar206._8_4_ = 2;
                    auVar206._0_8_ = 0x200000002;
                    auVar206._12_4_ = 2;
                    auVar208._16_4_ = 2;
                    auVar208._0_16_ = auVar206;
                    auVar208._20_4_ = 2;
                    auVar208._24_4_ = 2;
                    auVar208._28_4_ = 2;
                    auVar209 = ZEXT3264(auVar208);
                    local_200 = vpermps_avx2(auVar208,ZEXT1632(auVar85));
                    iStack_23c = local_240;
                    iStack_238 = local_240;
                    iStack_234 = local_240;
                    iStack_230 = local_240;
                    iStack_22c = local_240;
                    iStack_228 = local_240;
                    iStack_224 = local_240;
                    uStack_1bc = local_1c0;
                    uStack_1b8 = local_1c0;
                    uStack_1b4 = local_1c0;
                    uStack_1b0 = local_1c0;
                    uStack_1ac = local_1c0;
                    uStack_1a8 = local_1c0;
                    uStack_1a4 = local_1c0;
                    local_1a0 = local_2a0._0_8_;
                    uStack_198 = local_2a0._8_8_;
                    uStack_190 = local_2a0._16_8_;
                    uStack_188 = local_2a0._24_8_;
                    local_180 = local_280;
                    auVar109 = vpcmpeqd_avx2(local_280,local_280);
                    local_628[1] = auVar109;
                    *local_628 = auVar109;
                    local_160 = (local_670.context)->instID[0];
                    uStack_15c = local_160;
                    uStack_158 = local_160;
                    uStack_154 = local_160;
                    uStack_150 = local_160;
                    uStack_14c = local_160;
                    uStack_148 = local_160;
                    uStack_144 = local_160;
                    local_140 = (local_670.context)->instPrimID[0];
                    uStack_13c = local_140;
                    uStack_138 = local_140;
                    uStack_134 = local_140;
                    uStack_130 = local_140;
                    uStack_12c = local_140;
                    uStack_128 = local_140;
                    uStack_124 = local_140;
                    local_620 = local_2c0;
                    local_670.valid = (int *)local_620;
                    local_670.geometryUserPtr = pGVar73->userPtr;
                    local_670.hit = (RTCHitN *)&local_240;
                    local_670.N = 8;
                    local_670.ray = (RTCRayN *)ray;
                    if (pGVar73->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar198 = ZEXT1664(local_220._0_16_);
                      auVar209 = ZEXT1664(auVar206);
                      auVar213 = ZEXT1664(auVar81);
                      (*pGVar73->intersectionFilterN)(&local_670);
                      auVar220 = ZEXT3264(local_5c0);
                      auVar227 = ZEXT3264(local_5e0);
                      auVar230 = ZEXT3264(local_580);
                      auVar229 = ZEXT3264(local_560);
                      auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar228 = ZEXT1664(auVar85);
                    }
                    if (local_620 == (undefined1  [32])0x0) {
LAB_018073ff:
                      *(float *)(ray + k * 4 + 0x100) = local_540;
                    }
                    else {
                      p_Var12 = context->args->filter;
                      if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar73->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar198 = ZEXT1664(auVar198._0_16_);
                        auVar209 = ZEXT1664(auVar209._0_16_);
                        auVar213 = ZEXT1664(auVar213._0_16_);
                        (*p_Var12)(&local_670);
                        auVar220 = ZEXT3264(local_5c0);
                        auVar227 = ZEXT3264(local_5e0);
                        auVar230 = ZEXT3264(local_580);
                        auVar229 = ZEXT3264(local_560);
                        auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar228 = ZEXT1664(auVar85);
                      }
                      if (local_620 == (undefined1  [32])0x0) goto LAB_018073ff;
                      uVar26 = vptestmd_avx512vl(local_620,local_620);
                      iVar1 = *(int *)(local_670.hit + 4);
                      iVar2 = *(int *)(local_670.hit + 8);
                      iVar57 = *(int *)(local_670.hit + 0xc);
                      iVar58 = *(int *)(local_670.hit + 0x10);
                      iVar59 = *(int *)(local_670.hit + 0x14);
                      iVar60 = *(int *)(local_670.hit + 0x18);
                      iVar61 = *(int *)(local_670.hit + 0x1c);
                      bVar78 = (byte)uVar26;
                      bVar13 = (bool)((byte)(uVar26 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar26 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar26 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar26 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar26 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar26 >> 6) & 1);
                      bVar19 = SUB81(uVar26 >> 7,0);
                      *(uint *)(local_670.ray + 0x180) =
                           (uint)(bVar78 & 1) * *(int *)local_670.hit |
                           (uint)!(bool)(bVar78 & 1) * *(int *)(local_670.ray + 0x180);
                      *(uint *)(local_670.ray + 0x184) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_670.ray + 0x184);
                      *(uint *)(local_670.ray + 0x188) =
                           (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_670.ray + 0x188);
                      *(uint *)(local_670.ray + 0x18c) =
                           (uint)bVar15 * iVar57 | (uint)!bVar15 * *(int *)(local_670.ray + 0x18c);
                      *(uint *)(local_670.ray + 400) =
                           (uint)bVar16 * iVar58 | (uint)!bVar16 * *(int *)(local_670.ray + 400);
                      *(uint *)(local_670.ray + 0x194) =
                           (uint)bVar17 * iVar59 | (uint)!bVar17 * *(int *)(local_670.ray + 0x194);
                      *(uint *)(local_670.ray + 0x198) =
                           (uint)bVar18 * iVar60 | (uint)!bVar18 * *(int *)(local_670.ray + 0x198);
                      *(uint *)(local_670.ray + 0x19c) =
                           (uint)bVar19 * iVar61 | (uint)!bVar19 * *(int *)(local_670.ray + 0x19c);
                      iVar1 = *(int *)(local_670.hit + 0x24);
                      iVar2 = *(int *)(local_670.hit + 0x28);
                      iVar57 = *(int *)(local_670.hit + 0x2c);
                      iVar58 = *(int *)(local_670.hit + 0x30);
                      iVar59 = *(int *)(local_670.hit + 0x34);
                      iVar60 = *(int *)(local_670.hit + 0x38);
                      iVar61 = *(int *)(local_670.hit + 0x3c);
                      bVar13 = (bool)((byte)(uVar26 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar26 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar26 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar26 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar26 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar26 >> 6) & 1);
                      bVar19 = SUB81(uVar26 >> 7,0);
                      *(uint *)(local_670.ray + 0x1a0) =
                           (uint)(bVar78 & 1) * *(int *)(local_670.hit + 0x20) |
                           (uint)!(bool)(bVar78 & 1) * *(int *)(local_670.ray + 0x1a0);
                      *(uint *)(local_670.ray + 0x1a4) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_670.ray + 0x1a4);
                      *(uint *)(local_670.ray + 0x1a8) =
                           (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_670.ray + 0x1a8);
                      *(uint *)(local_670.ray + 0x1ac) =
                           (uint)bVar15 * iVar57 | (uint)!bVar15 * *(int *)(local_670.ray + 0x1ac);
                      *(uint *)(local_670.ray + 0x1b0) =
                           (uint)bVar16 * iVar58 | (uint)!bVar16 * *(int *)(local_670.ray + 0x1b0);
                      *(uint *)(local_670.ray + 0x1b4) =
                           (uint)bVar17 * iVar59 | (uint)!bVar17 * *(int *)(local_670.ray + 0x1b4);
                      *(uint *)(local_670.ray + 0x1b8) =
                           (uint)bVar18 * iVar60 | (uint)!bVar18 * *(int *)(local_670.ray + 0x1b8);
                      *(uint *)(local_670.ray + 0x1bc) =
                           (uint)bVar19 * iVar61 | (uint)!bVar19 * *(int *)(local_670.ray + 0x1bc);
                      iVar1 = *(int *)(local_670.hit + 0x44);
                      iVar2 = *(int *)(local_670.hit + 0x48);
                      iVar57 = *(int *)(local_670.hit + 0x4c);
                      iVar58 = *(int *)(local_670.hit + 0x50);
                      iVar59 = *(int *)(local_670.hit + 0x54);
                      iVar60 = *(int *)(local_670.hit + 0x58);
                      iVar61 = *(int *)(local_670.hit + 0x5c);
                      bVar13 = (bool)((byte)(uVar26 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar26 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar26 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar26 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar26 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar26 >> 6) & 1);
                      bVar19 = SUB81(uVar26 >> 7,0);
                      *(uint *)(local_670.ray + 0x1c0) =
                           (uint)(bVar78 & 1) * *(int *)(local_670.hit + 0x40) |
                           (uint)!(bool)(bVar78 & 1) * *(int *)(local_670.ray + 0x1c0);
                      *(uint *)(local_670.ray + 0x1c4) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_670.ray + 0x1c4);
                      *(uint *)(local_670.ray + 0x1c8) =
                           (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_670.ray + 0x1c8);
                      *(uint *)(local_670.ray + 0x1cc) =
                           (uint)bVar15 * iVar57 | (uint)!bVar15 * *(int *)(local_670.ray + 0x1cc);
                      *(uint *)(local_670.ray + 0x1d0) =
                           (uint)bVar16 * iVar58 | (uint)!bVar16 * *(int *)(local_670.ray + 0x1d0);
                      *(uint *)(local_670.ray + 0x1d4) =
                           (uint)bVar17 * iVar59 | (uint)!bVar17 * *(int *)(local_670.ray + 0x1d4);
                      *(uint *)(local_670.ray + 0x1d8) =
                           (uint)bVar18 * iVar60 | (uint)!bVar18 * *(int *)(local_670.ray + 0x1d8);
                      *(uint *)(local_670.ray + 0x1dc) =
                           (uint)bVar19 * iVar61 | (uint)!bVar19 * *(int *)(local_670.ray + 0x1dc);
                      iVar1 = *(int *)(local_670.hit + 100);
                      iVar2 = *(int *)(local_670.hit + 0x68);
                      iVar57 = *(int *)(local_670.hit + 0x6c);
                      iVar58 = *(int *)(local_670.hit + 0x70);
                      iVar59 = *(int *)(local_670.hit + 0x74);
                      iVar60 = *(int *)(local_670.hit + 0x78);
                      iVar61 = *(int *)(local_670.hit + 0x7c);
                      bVar13 = (bool)((byte)(uVar26 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar26 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar26 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar26 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar26 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar26 >> 6) & 1);
                      bVar19 = SUB81(uVar26 >> 7,0);
                      *(uint *)(local_670.ray + 0x1e0) =
                           (uint)(bVar78 & 1) * *(int *)(local_670.hit + 0x60) |
                           (uint)!(bool)(bVar78 & 1) * *(int *)(local_670.ray + 0x1e0);
                      *(uint *)(local_670.ray + 0x1e4) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_670.ray + 0x1e4);
                      *(uint *)(local_670.ray + 0x1e8) =
                           (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_670.ray + 0x1e8);
                      *(uint *)(local_670.ray + 0x1ec) =
                           (uint)bVar15 * iVar57 | (uint)!bVar15 * *(int *)(local_670.ray + 0x1ec);
                      *(uint *)(local_670.ray + 0x1f0) =
                           (uint)bVar16 * iVar58 | (uint)!bVar16 * *(int *)(local_670.ray + 0x1f0);
                      *(uint *)(local_670.ray + 500) =
                           (uint)bVar17 * iVar59 | (uint)!bVar17 * *(int *)(local_670.ray + 500);
                      *(uint *)(local_670.ray + 0x1f8) =
                           (uint)bVar18 * iVar60 | (uint)!bVar18 * *(int *)(local_670.ray + 0x1f8);
                      *(uint *)(local_670.ray + 0x1fc) =
                           (uint)bVar19 * iVar61 | (uint)!bVar19 * *(int *)(local_670.ray + 0x1fc);
                      iVar1 = *(int *)(local_670.hit + 0x84);
                      iVar2 = *(int *)(local_670.hit + 0x88);
                      iVar57 = *(int *)(local_670.hit + 0x8c);
                      iVar58 = *(int *)(local_670.hit + 0x90);
                      iVar59 = *(int *)(local_670.hit + 0x94);
                      iVar60 = *(int *)(local_670.hit + 0x98);
                      iVar61 = *(int *)(local_670.hit + 0x9c);
                      bVar13 = (bool)((byte)(uVar26 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar26 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar26 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar26 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar26 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar26 >> 6) & 1);
                      bVar19 = SUB81(uVar26 >> 7,0);
                      *(uint *)(local_670.ray + 0x200) =
                           (uint)(bVar78 & 1) * *(int *)(local_670.hit + 0x80) |
                           (uint)!(bool)(bVar78 & 1) * *(int *)(local_670.ray + 0x200);
                      *(uint *)(local_670.ray + 0x204) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_670.ray + 0x204);
                      *(uint *)(local_670.ray + 0x208) =
                           (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_670.ray + 0x208);
                      *(uint *)(local_670.ray + 0x20c) =
                           (uint)bVar15 * iVar57 | (uint)!bVar15 * *(int *)(local_670.ray + 0x20c);
                      *(uint *)(local_670.ray + 0x210) =
                           (uint)bVar16 * iVar58 | (uint)!bVar16 * *(int *)(local_670.ray + 0x210);
                      *(uint *)(local_670.ray + 0x214) =
                           (uint)bVar17 * iVar59 | (uint)!bVar17 * *(int *)(local_670.ray + 0x214);
                      *(uint *)(local_670.ray + 0x218) =
                           (uint)bVar18 * iVar60 | (uint)!bVar18 * *(int *)(local_670.ray + 0x218);
                      *(uint *)(local_670.ray + 0x21c) =
                           (uint)bVar19 * iVar61 | (uint)!bVar19 * *(int *)(local_670.ray + 0x21c);
                      auVar109 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xa0));
                      *(undefined1 (*) [32])(local_670.ray + 0x220) = auVar109;
                      auVar109 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xc0));
                      *(undefined1 (*) [32])(local_670.ray + 0x240) = auVar109;
                      auVar109 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xe0));
                      *(undefined1 (*) [32])(local_670.ray + 0x260) = auVar109;
                      auVar109 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0x100));
                      *(undefined1 (*) [32])(local_670.ray + 0x280) = auVar109;
                      local_540 = *(float *)(ray + k * 4 + 0x100);
                      fStack_53c = 0.0;
                      fStack_538 = 0.0;
                      fStack_534 = 0.0;
                    }
                    auVar100 = auVar227._0_32_;
                    bVar78 = ~(byte)(1 << ((uint)uVar70 & 0x1f)) & (byte)uVar76;
                    auVar156._4_4_ = local_540;
                    auVar156._0_4_ = local_540;
                    auVar156._8_4_ = local_540;
                    auVar156._12_4_ = local_540;
                    auVar156._16_4_ = local_540;
                    auVar156._20_4_ = local_540;
                    auVar156._24_4_ = local_540;
                    auVar156._28_4_ = local_540;
                    uVar24 = vcmpps_avx512vl(auVar220._0_32_,auVar156,2);
                    if ((bVar78 & (byte)uVar24) == 0) goto LAB_018062a3;
                    bVar78 = bVar78 & (byte)uVar24;
                    uVar76 = (ulong)bVar78;
                    auVar157._8_4_ = 0x7f800000;
                    auVar157._0_8_ = 0x7f8000007f800000;
                    auVar157._12_4_ = 0x7f800000;
                    auVar157._16_4_ = 0x7f800000;
                    auVar157._20_4_ = 0x7f800000;
                    auVar157._24_4_ = 0x7f800000;
                    auVar157._28_4_ = 0x7f800000;
                    auVar109 = vblendmps_avx512vl(auVar157,auVar220._0_32_);
                    auVar135._0_4_ =
                         (uint)(bVar78 & 1) * auVar109._0_4_ |
                         (uint)!(bool)(bVar78 & 1) * 0x7f800000;
                    bVar13 = (bool)(bVar78 >> 1 & 1);
                    auVar135._4_4_ = (uint)bVar13 * auVar109._4_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar78 >> 2 & 1);
                    auVar135._8_4_ = (uint)bVar13 * auVar109._8_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar78 >> 3 & 1);
                    auVar135._12_4_ = (uint)bVar13 * auVar109._12_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar78 >> 4 & 1);
                    auVar135._16_4_ = (uint)bVar13 * auVar109._16_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar78 >> 5 & 1);
                    auVar135._20_4_ = (uint)bVar13 * auVar109._20_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar78 >> 6 & 1);
                    auVar135._24_4_ = (uint)bVar13 * auVar109._24_4_ | (uint)!bVar13 * 0x7f800000;
                    auVar135._28_4_ =
                         (uint)(bVar78 >> 7) * auVar109._28_4_ |
                         (uint)!(bool)(bVar78 >> 7) * 0x7f800000;
                    auVar109 = vshufps_avx(auVar135,auVar135,0xb1);
                    auVar109 = vminps_avx(auVar135,auVar109);
                    auVar110 = vshufpd_avx(auVar109,auVar109,5);
                    auVar109 = vminps_avx(auVar109,auVar110);
                    auVar110 = vpermpd_avx2(auVar109,0x4e);
                    auVar109 = vminps_avx(auVar109,auVar110);
                    uVar24 = vcmpps_avx512vl(auVar135,auVar109,0);
                    bVar69 = (byte)uVar24 & bVar78;
                    if (bVar69 != 0) {
                      bVar78 = bVar69;
                    }
                    uVar77 = 0;
                    for (uVar71 = (uint)bVar78; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000
                        ) {
                      uVar77 = uVar77 + 1;
                    }
                    uVar70 = (ulong)uVar77;
                  } while( true );
                }
                fVar166 = local_340[uVar70];
                uVar144 = *(undefined4 *)(local_320 + uVar70 * 4);
                fVar158 = 1.0 - fVar166;
                auVar20 = vfnmadd231ss_fma(ZEXT416((uint)(fVar166 * (fVar158 + fVar158))),
                                           ZEXT416((uint)fVar158),ZEXT416((uint)fVar158));
                auVar147 = ZEXT416((uint)fVar166);
                auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar147,
                                          ZEXT416(0xc0a00000));
                auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar166 * fVar166 * 3.0)),
                                          ZEXT416((uint)(fVar166 + fVar166)),auVar85);
                auVar213 = ZEXT1664(auVar81);
                auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar147,
                                          ZEXT416(0x40000000));
                auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar158 * fVar158 * -3.0)),
                                          ZEXT416((uint)(fVar158 + fVar158)),auVar85);
                auVar147 = vfmadd231ss_fma(ZEXT416((uint)(fVar166 * fVar166)),auVar147,
                                           ZEXT416((uint)(fVar158 * -2.0)));
                fVar158 = auVar20._0_4_ * 0.5;
                fVar159 = auVar81._0_4_ * 0.5;
                auVar198 = ZEXT464((uint)fVar159);
                fVar160 = auVar85._0_4_ * 0.5;
                fVar173 = auVar147._0_4_ * 0.5;
                auVar179._0_4_ = fVar173 * local_6d0;
                auVar179._4_4_ = fVar173 * fStack_6cc;
                auVar179._8_4_ = fVar173 * fStack_6c8;
                auVar179._12_4_ = fVar173 * fStack_6c4;
                auVar201._4_4_ = fVar160;
                auVar201._0_4_ = fVar160;
                auVar201._8_4_ = fVar160;
                auVar201._12_4_ = fVar160;
                auVar85 = vfmadd132ps_fma(auVar201,auVar179,*pauVar4);
                auVar209 = ZEXT1664(auVar85);
                auVar180._4_4_ = fVar159;
                auVar180._0_4_ = fVar159;
                auVar180._8_4_ = fVar159;
                auVar180._12_4_ = fVar159;
                auVar85 = vfmadd132ps_fma(auVar180,auVar85,*pauVar3);
                auVar168._4_4_ = fVar158;
                auVar168._0_4_ = fVar158;
                auVar168._8_4_ = fVar158;
                auVar168._12_4_ = fVar158;
                auVar85 = vfmadd213ps_fma(auVar168,auVar84,auVar85);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar70 * 4);
                *(int *)(ray + k * 4 + 0x180) = auVar85._0_4_;
                uVar11 = vextractps_avx(auVar85,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar11;
                uVar11 = vextractps_avx(auVar85,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar11;
                *(float *)(ray + k * 4 + 0x1e0) = fVar166;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar144;
                *(uint *)(ray + k * 4 + 0x220) = uVar9;
                *(uint *)(ray + k * 4 + 0x240) = uVar8;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
LAB_018062a3:
                fVar166 = (float)local_640._0_4_;
              }
            }
          }
        }
      }
    }
    local_640._0_4_ = fVar166;
    if (8 < iVar10) {
      auVar109 = vpbroadcastd_avx512vl();
      auVar227 = ZEXT3264(auVar109);
      local_540 = (float)local_640._0_4_;
      fStack_53c = (float)local_640._0_4_;
      fStack_538 = (float)local_640._0_4_;
      fStack_534 = (float)local_640._0_4_;
      fStack_530 = (float)local_640._0_4_;
      fStack_52c = (float)local_640._0_4_;
      fStack_528 = (float)local_640._0_4_;
      fStack_524 = (float)local_640._0_4_;
      uStack_51c = local_520;
      uStack_518 = local_520;
      uStack_514 = local_520;
      uStack_510 = local_520;
      uStack_50c = local_520;
      uStack_508 = local_520;
      uStack_504 = local_520;
      local_100 = 1.0 / (float)local_5a0._0_4_;
      fStack_fc = local_100;
      fStack_f8 = local_100;
      fStack_f4 = local_100;
      fStack_f0 = local_100;
      fStack_ec = local_100;
      fStack_e8 = local_100;
      fStack_e4 = local_100;
      lVar72 = 8;
      local_5e0 = auVar100;
LAB_0180633d:
      if (lVar72 < iVar10) {
        auVar109 = vpbroadcastd_avx512vl();
        auVar109 = vpor_avx2(auVar109,_DAT_01fb4ba0);
        uVar25 = vpcmpgtd_avx512vl(auVar227._0_32_,auVar109);
        auVar109 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar72 * 4 + lVar74);
        auVar110 = *(undefined1 (*) [32])(lVar74 + 0x22047f0 + lVar72 * 4);
        auVar107 = *(undefined1 (*) [32])(lVar74 + 0x2204c74 + lVar72 * 4);
        auVar106 = *(undefined1 (*) [32])(lVar74 + 0x22050f8 + lVar72 * 4);
        auVar220._0_4_ = auVar106._0_4_ * (float)local_4e0._0_4_;
        auVar220._4_4_ = auVar106._4_4_ * (float)local_4e0._4_4_;
        auVar220._8_4_ = auVar106._8_4_ * fStack_4d8;
        auVar220._12_4_ = auVar106._12_4_ * fStack_4d4;
        auVar220._16_4_ = auVar106._16_4_ * fStack_4d0;
        auVar220._20_4_ = auVar106._20_4_ * fStack_4cc;
        auVar220._28_36_ = auVar209._28_36_;
        auVar220._24_4_ = auVar106._24_4_ * fStack_4c8;
        auVar209._0_4_ = auVar106._0_4_ * (float)local_500._0_4_;
        auVar209._4_4_ = auVar106._4_4_ * (float)local_500._4_4_;
        auVar209._8_4_ = auVar106._8_4_ * fStack_4f8;
        auVar209._12_4_ = auVar106._12_4_ * fStack_4f4;
        auVar209._16_4_ = auVar106._16_4_ * fStack_4f0;
        auVar209._20_4_ = auVar106._20_4_ * fStack_4ec;
        auVar209._28_36_ = auVar198._28_36_;
        auVar209._24_4_ = auVar106._24_4_ * fStack_4e8;
        auVar93 = vmulps_avx512vl(local_e0,auVar106);
        auVar94 = vfmadd231ps_avx512vl(auVar220._0_32_,auVar107,local_4a0);
        auVar105 = vfmadd231ps_avx512vl(auVar209._0_32_,auVar107,local_4c0);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar107,local_c0);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar110,local_460);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar110,local_480);
        auVar95 = vfmadd231ps_avx512vl(auVar93,auVar110,local_a0);
        auVar85 = vfmadd231ps_fma(auVar94,auVar109,local_420);
        auVar209 = ZEXT1664(auVar85);
        auVar81 = vfmadd231ps_fma(auVar105,auVar109,local_440);
        auVar198 = ZEXT1664(auVar81);
        auVar93 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar72 * 4 + lVar74);
        auVar94 = *(undefined1 (*) [32])(lVar74 + 0x2206c10 + lVar72 * 4);
        auVar98 = vfmadd231ps_avx512vl(auVar95,auVar109,local_80);
        auVar105 = *(undefined1 (*) [32])(lVar74 + 0x2207094 + lVar72 * 4);
        auVar95 = *(undefined1 (*) [32])(lVar74 + 0x2207518 + lVar72 * 4);
        auVar214._0_4_ = auVar95._0_4_ * (float)local_4e0._0_4_;
        auVar214._4_4_ = auVar95._4_4_ * (float)local_4e0._4_4_;
        auVar214._8_4_ = auVar95._8_4_ * fStack_4d8;
        auVar214._12_4_ = auVar95._12_4_ * fStack_4d4;
        auVar214._16_4_ = auVar95._16_4_ * fStack_4d0;
        auVar214._20_4_ = auVar95._20_4_ * fStack_4cc;
        auVar214._28_36_ = auVar213._28_36_;
        auVar214._24_4_ = auVar95._24_4_ * fStack_4c8;
        auVar40._4_4_ = auVar95._4_4_ * (float)local_500._4_4_;
        auVar40._0_4_ = auVar95._0_4_ * (float)local_500._0_4_;
        auVar40._8_4_ = auVar95._8_4_ * fStack_4f8;
        auVar40._12_4_ = auVar95._12_4_ * fStack_4f4;
        auVar40._16_4_ = auVar95._16_4_ * fStack_4f0;
        auVar40._20_4_ = auVar95._20_4_ * fStack_4ec;
        auVar40._24_4_ = auVar95._24_4_ * fStack_4e8;
        auVar40._28_4_ = uStack_4e4;
        auVar96 = vmulps_avx512vl(local_e0,auVar95);
        auVar97 = vfmadd231ps_avx512vl(auVar214._0_32_,auVar105,local_4a0);
        auVar99 = vfmadd231ps_avx512vl(auVar40,auVar105,local_4c0);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar105,local_c0);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar94,local_460);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar94,local_480);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar94,local_a0);
        auVar147 = vfmadd231ps_fma(auVar97,auVar93,local_420);
        auVar213 = ZEXT1664(auVar147);
        auVar20 = vfmadd231ps_fma(auVar99,auVar93,local_440);
        auVar99 = vfmadd231ps_avx512vl(auVar96,auVar93,local_80);
        auVar100 = vmaxps_avx512vl(auVar98,auVar99);
        auVar96 = vsubps_avx(ZEXT1632(auVar147),ZEXT1632(auVar85));
        auVar97 = vsubps_avx(ZEXT1632(auVar20),ZEXT1632(auVar81));
        auVar101 = vmulps_avx512vl(ZEXT1632(auVar81),auVar96);
        auVar102 = vmulps_avx512vl(ZEXT1632(auVar85),auVar97);
        auVar101 = vsubps_avx512vl(auVar101,auVar102);
        auVar102 = vmulps_avx512vl(auVar97,auVar97);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar96,auVar96);
        auVar100 = vmulps_avx512vl(auVar100,auVar100);
        auVar100 = vmulps_avx512vl(auVar100,auVar102);
        auVar101 = vmulps_avx512vl(auVar101,auVar101);
        uVar24 = vcmpps_avx512vl(auVar101,auVar100,2);
        bVar78 = (byte)uVar25 & (byte)uVar24;
        if (bVar78 != 0) {
          auVar95 = vmulps_avx512vl(local_260,auVar95);
          auVar105 = vfmadd213ps_avx512vl(auVar105,local_5e0,auVar95);
          local_580 = auVar230._0_32_;
          auVar94 = vfmadd213ps_avx512vl(auVar94,local_580,auVar105);
          local_560 = auVar229._0_32_;
          auVar93 = vfmadd213ps_avx512vl(auVar93,local_560,auVar94);
          auVar106 = vmulps_avx512vl(local_260,auVar106);
          auVar107 = vfmadd213ps_avx512vl(auVar107,local_5e0,auVar106);
          auVar110 = vfmadd213ps_avx512vl(auVar110,local_580,auVar107);
          auVar94 = vfmadd213ps_avx512vl(auVar109,local_560,auVar110);
          auVar109 = *(undefined1 (*) [32])(lVar74 + 0x220557c + lVar72 * 4);
          auVar110 = *(undefined1 (*) [32])(lVar74 + 0x2205a00 + lVar72 * 4);
          auVar107 = *(undefined1 (*) [32])(lVar74 + 0x2205e84 + lVar72 * 4);
          auVar106 = *(undefined1 (*) [32])(lVar74 + 0x2206308 + lVar72 * 4);
          auVar105 = vmulps_avx512vl(_local_4e0,auVar106);
          auVar95 = vmulps_avx512vl(_local_500,auVar106);
          auVar106 = vmulps_avx512vl(local_260,auVar106);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar107,local_4a0);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar107,local_4c0);
          auVar91 = vfmadd231ps_fma(auVar106,auVar107,local_5e0);
          auVar107 = vfmadd231ps_avx512vl(auVar105,auVar110,local_460);
          auVar106 = vfmadd231ps_avx512vl(auVar95,auVar110,local_480);
          auVar110 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),local_580,auVar110);
          auVar105 = vfmadd231ps_avx512vl(auVar107,auVar109,local_420);
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar109,local_440);
          auVar95 = vfmadd231ps_avx512vl(auVar110,local_560,auVar109);
          auVar109 = *(undefined1 (*) [32])(lVar74 + 0x220799c + lVar72 * 4);
          auVar110 = *(undefined1 (*) [32])(lVar74 + 0x22082a4 + lVar72 * 4);
          auVar107 = *(undefined1 (*) [32])(lVar74 + 0x2208728 + lVar72 * 4);
          auVar100 = vmulps_avx512vl(_local_4e0,auVar107);
          auVar101 = vmulps_avx512vl(_local_500,auVar107);
          auVar107 = vmulps_avx512vl(local_260,auVar107);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar110,local_4a0);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar110,local_4c0);
          auVar107 = vfmadd231ps_avx512vl(auVar107,local_5e0,auVar110);
          auVar110 = *(undefined1 (*) [32])(lVar74 + 0x2207e20 + lVar72 * 4);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar110,local_460);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar110,local_480);
          auVar110 = vfmadd231ps_avx512vl(auVar107,local_580,auVar110);
          auVar107 = vfmadd231ps_avx512vl(auVar100,auVar109,local_420);
          auVar100 = vfmadd231ps_avx512vl(auVar101,auVar109,local_440);
          auVar110 = vfmadd231ps_avx512vl(auVar110,local_560,auVar109);
          auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar105,auVar101);
          vandps_avx512vl(auVar106,auVar101);
          auVar109 = vmaxps_avx(auVar101,auVar101);
          vandps_avx512vl(auVar95,auVar101);
          auVar109 = vmaxps_avx(auVar109,auVar101);
          auVar67._4_4_ = fStack_53c;
          auVar67._0_4_ = local_540;
          auVar67._8_4_ = fStack_538;
          auVar67._12_4_ = fStack_534;
          auVar67._16_4_ = fStack_530;
          auVar67._20_4_ = fStack_52c;
          auVar67._24_4_ = fStack_528;
          auVar67._28_4_ = fStack_524;
          uVar70 = vcmpps_avx512vl(auVar109,auVar67,1);
          bVar13 = (bool)((byte)uVar70 & 1);
          auVar123._0_4_ = (float)((uint)bVar13 * auVar96._0_4_ | (uint)!bVar13 * auVar105._0_4_);
          bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar123._4_4_ = (float)((uint)bVar13 * auVar96._4_4_ | (uint)!bVar13 * auVar105._4_4_);
          bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar123._8_4_ = (float)((uint)bVar13 * auVar96._8_4_ | (uint)!bVar13 * auVar105._8_4_);
          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar123._12_4_ = (float)((uint)bVar13 * auVar96._12_4_ | (uint)!bVar13 * auVar105._12_4_)
          ;
          bVar13 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar123._16_4_ = (float)((uint)bVar13 * auVar96._16_4_ | (uint)!bVar13 * auVar105._16_4_)
          ;
          bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar123._20_4_ = (float)((uint)bVar13 * auVar96._20_4_ | (uint)!bVar13 * auVar105._20_4_)
          ;
          bVar13 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar123._24_4_ = (float)((uint)bVar13 * auVar96._24_4_ | (uint)!bVar13 * auVar105._24_4_)
          ;
          bVar13 = SUB81(uVar70 >> 7,0);
          auVar123._28_4_ = (uint)bVar13 * auVar96._28_4_ | (uint)!bVar13 * auVar105._28_4_;
          bVar13 = (bool)((byte)uVar70 & 1);
          auVar124._0_4_ = (float)((uint)bVar13 * auVar97._0_4_ | (uint)!bVar13 * auVar106._0_4_);
          bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar124._4_4_ = (float)((uint)bVar13 * auVar97._4_4_ | (uint)!bVar13 * auVar106._4_4_);
          bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar124._8_4_ = (float)((uint)bVar13 * auVar97._8_4_ | (uint)!bVar13 * auVar106._8_4_);
          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar124._12_4_ = (float)((uint)bVar13 * auVar97._12_4_ | (uint)!bVar13 * auVar106._12_4_)
          ;
          bVar13 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar124._16_4_ = (float)((uint)bVar13 * auVar97._16_4_ | (uint)!bVar13 * auVar106._16_4_)
          ;
          bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar124._20_4_ = (float)((uint)bVar13 * auVar97._20_4_ | (uint)!bVar13 * auVar106._20_4_)
          ;
          bVar13 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar124._24_4_ = (float)((uint)bVar13 * auVar97._24_4_ | (uint)!bVar13 * auVar106._24_4_)
          ;
          bVar13 = SUB81(uVar70 >> 7,0);
          auVar124._28_4_ = (uint)bVar13 * auVar97._28_4_ | (uint)!bVar13 * auVar106._28_4_;
          vandps_avx512vl(auVar107,auVar101);
          vandps_avx512vl(auVar100,auVar101);
          auVar109 = vmaxps_avx(auVar124,auVar124);
          vandps_avx512vl(auVar110,auVar101);
          auVar109 = vmaxps_avx(auVar109,auVar124);
          uVar70 = vcmpps_avx512vl(auVar109,auVar67,1);
          bVar13 = (bool)((byte)uVar70 & 1);
          auVar125._0_4_ = (uint)bVar13 * auVar96._0_4_ | (uint)!bVar13 * auVar107._0_4_;
          bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar125._4_4_ = (uint)bVar13 * auVar96._4_4_ | (uint)!bVar13 * auVar107._4_4_;
          bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar125._8_4_ = (uint)bVar13 * auVar96._8_4_ | (uint)!bVar13 * auVar107._8_4_;
          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar125._12_4_ = (uint)bVar13 * auVar96._12_4_ | (uint)!bVar13 * auVar107._12_4_;
          bVar13 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar125._16_4_ = (uint)bVar13 * auVar96._16_4_ | (uint)!bVar13 * auVar107._16_4_;
          bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar125._20_4_ = (uint)bVar13 * auVar96._20_4_ | (uint)!bVar13 * auVar107._20_4_;
          bVar13 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar125._24_4_ = (uint)bVar13 * auVar96._24_4_ | (uint)!bVar13 * auVar107._24_4_;
          bVar13 = SUB81(uVar70 >> 7,0);
          auVar125._28_4_ = (uint)bVar13 * auVar96._28_4_ | (uint)!bVar13 * auVar107._28_4_;
          bVar13 = (bool)((byte)uVar70 & 1);
          auVar126._0_4_ = (float)((uint)bVar13 * auVar97._0_4_ | (uint)!bVar13 * auVar100._0_4_);
          bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar126._4_4_ = (float)((uint)bVar13 * auVar97._4_4_ | (uint)!bVar13 * auVar100._4_4_);
          bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar126._8_4_ = (float)((uint)bVar13 * auVar97._8_4_ | (uint)!bVar13 * auVar100._8_4_);
          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar126._12_4_ = (float)((uint)bVar13 * auVar97._12_4_ | (uint)!bVar13 * auVar100._12_4_)
          ;
          bVar13 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar126._16_4_ = (float)((uint)bVar13 * auVar97._16_4_ | (uint)!bVar13 * auVar100._16_4_)
          ;
          bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar126._20_4_ = (float)((uint)bVar13 * auVar97._20_4_ | (uint)!bVar13 * auVar100._20_4_)
          ;
          bVar13 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar126._24_4_ = (float)((uint)bVar13 * auVar97._24_4_ | (uint)!bVar13 * auVar100._24_4_)
          ;
          bVar13 = SUB81(uVar70 >> 7,0);
          auVar126._28_4_ = (uint)bVar13 * auVar97._28_4_ | (uint)!bVar13 * auVar100._28_4_;
          auVar218._8_4_ = 0x80000000;
          auVar218._0_8_ = 0x8000000080000000;
          auVar218._12_4_ = 0x80000000;
          auVar218._16_4_ = 0x80000000;
          auVar218._20_4_ = 0x80000000;
          auVar218._24_4_ = 0x80000000;
          auVar218._28_4_ = 0x80000000;
          auVar109 = vxorps_avx512vl(auVar125,auVar218);
          auVar92 = vxorps_avx512vl(auVar101._0_16_,auVar101._0_16_);
          auVar110 = vfmadd213ps_avx512vl(auVar123,auVar123,ZEXT1632(auVar92));
          auVar91 = vfmadd231ps_fma(auVar110,auVar124,auVar124);
          auVar110 = vrsqrt14ps_avx512vl(ZEXT1632(auVar91));
          auVar226._8_4_ = 0xbf000000;
          auVar226._0_8_ = 0xbf000000bf000000;
          auVar226._12_4_ = 0xbf000000;
          auVar226._16_4_ = 0xbf000000;
          auVar226._20_4_ = 0xbf000000;
          auVar226._24_4_ = 0xbf000000;
          auVar226._28_4_ = 0xbf000000;
          fVar166 = auVar110._0_4_;
          fVar158 = auVar110._4_4_;
          fVar159 = auVar110._8_4_;
          fVar160 = auVar110._12_4_;
          fVar173 = auVar110._16_4_;
          fVar172 = auVar110._20_4_;
          fVar190 = auVar110._24_4_;
          auVar41._4_4_ = fVar158 * fVar158 * fVar158 * auVar91._4_4_ * -0.5;
          auVar41._0_4_ = fVar166 * fVar166 * fVar166 * auVar91._0_4_ * -0.5;
          auVar41._8_4_ = fVar159 * fVar159 * fVar159 * auVar91._8_4_ * -0.5;
          auVar41._12_4_ = fVar160 * fVar160 * fVar160 * auVar91._12_4_ * -0.5;
          auVar41._16_4_ = fVar173 * fVar173 * fVar173 * -0.0;
          auVar41._20_4_ = fVar172 * fVar172 * fVar172 * -0.0;
          auVar41._24_4_ = fVar190 * fVar190 * fVar190 * -0.0;
          auVar41._28_4_ = auVar124._28_4_;
          auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar110 = vfmadd231ps_avx512vl(auVar41,auVar107,auVar110);
          auVar42._4_4_ = auVar124._4_4_ * auVar110._4_4_;
          auVar42._0_4_ = auVar124._0_4_ * auVar110._0_4_;
          auVar42._8_4_ = auVar124._8_4_ * auVar110._8_4_;
          auVar42._12_4_ = auVar124._12_4_ * auVar110._12_4_;
          auVar42._16_4_ = auVar124._16_4_ * auVar110._16_4_;
          auVar42._20_4_ = auVar124._20_4_ * auVar110._20_4_;
          auVar42._24_4_ = auVar124._24_4_ * auVar110._24_4_;
          auVar42._28_4_ = 0;
          auVar43._4_4_ = auVar110._4_4_ * -auVar123._4_4_;
          auVar43._0_4_ = auVar110._0_4_ * -auVar123._0_4_;
          auVar43._8_4_ = auVar110._8_4_ * -auVar123._8_4_;
          auVar43._12_4_ = auVar110._12_4_ * -auVar123._12_4_;
          auVar43._16_4_ = auVar110._16_4_ * -auVar123._16_4_;
          auVar43._20_4_ = auVar110._20_4_ * -auVar123._20_4_;
          auVar43._24_4_ = auVar110._24_4_ * -auVar123._24_4_;
          auVar43._28_4_ = auVar124._28_4_;
          auVar106 = vmulps_avx512vl(auVar110,ZEXT1632(auVar92));
          auVar95 = ZEXT1632(auVar92);
          auVar110 = vfmadd213ps_avx512vl(auVar125,auVar125,auVar95);
          auVar110 = vfmadd231ps_avx512vl(auVar110,auVar126,auVar126);
          auVar105 = vrsqrt14ps_avx512vl(auVar110);
          auVar110 = vmulps_avx512vl(auVar110,auVar226);
          fVar166 = auVar105._0_4_;
          fVar158 = auVar105._4_4_;
          fVar159 = auVar105._8_4_;
          fVar160 = auVar105._12_4_;
          fVar173 = auVar105._16_4_;
          fVar172 = auVar105._20_4_;
          fVar190 = auVar105._24_4_;
          auVar44._4_4_ = fVar158 * fVar158 * fVar158 * auVar110._4_4_;
          auVar44._0_4_ = fVar166 * fVar166 * fVar166 * auVar110._0_4_;
          auVar44._8_4_ = fVar159 * fVar159 * fVar159 * auVar110._8_4_;
          auVar44._12_4_ = fVar160 * fVar160 * fVar160 * auVar110._12_4_;
          auVar44._16_4_ = fVar173 * fVar173 * fVar173 * auVar110._16_4_;
          auVar44._20_4_ = fVar172 * fVar172 * fVar172 * auVar110._20_4_;
          auVar44._24_4_ = fVar190 * fVar190 * fVar190 * auVar110._24_4_;
          auVar44._28_4_ = auVar110._28_4_;
          auVar110 = vfmadd231ps_avx512vl(auVar44,auVar107,auVar105);
          auVar45._4_4_ = auVar126._4_4_ * auVar110._4_4_;
          auVar45._0_4_ = auVar126._0_4_ * auVar110._0_4_;
          auVar45._8_4_ = auVar126._8_4_ * auVar110._8_4_;
          auVar45._12_4_ = auVar126._12_4_ * auVar110._12_4_;
          auVar45._16_4_ = auVar126._16_4_ * auVar110._16_4_;
          auVar45._20_4_ = auVar126._20_4_ * auVar110._20_4_;
          auVar45._24_4_ = auVar126._24_4_ * auVar110._24_4_;
          auVar45._28_4_ = auVar105._28_4_;
          auVar46._4_4_ = auVar110._4_4_ * auVar109._4_4_;
          auVar46._0_4_ = auVar110._0_4_ * auVar109._0_4_;
          auVar46._8_4_ = auVar110._8_4_ * auVar109._8_4_;
          auVar46._12_4_ = auVar110._12_4_ * auVar109._12_4_;
          auVar46._16_4_ = auVar110._16_4_ * auVar109._16_4_;
          auVar46._20_4_ = auVar110._20_4_ * auVar109._20_4_;
          auVar46._24_4_ = auVar110._24_4_ * auVar109._24_4_;
          auVar46._28_4_ = auVar109._28_4_;
          auVar109 = vmulps_avx512vl(auVar110,auVar95);
          auVar91 = vfmadd213ps_fma(auVar42,auVar98,ZEXT1632(auVar85));
          auVar86 = vfmadd213ps_fma(auVar43,auVar98,ZEXT1632(auVar81));
          auVar107 = vfmadd213ps_avx512vl(auVar106,auVar98,auVar94);
          auVar105 = vfmadd213ps_avx512vl(auVar45,auVar99,ZEXT1632(auVar147));
          auVar90 = vfnmadd213ps_fma(auVar42,auVar98,ZEXT1632(auVar85));
          auVar85 = vfmadd213ps_fma(auVar46,auVar99,ZEXT1632(auVar20));
          auVar88 = vfnmadd213ps_fma(auVar43,auVar98,ZEXT1632(auVar81));
          auVar81 = vfmadd213ps_fma(auVar109,auVar99,auVar93);
          auVar89 = vfnmadd231ps_fma(auVar94,auVar98,auVar106);
          auVar145 = vfnmadd213ps_fma(auVar45,auVar99,ZEXT1632(auVar147));
          auVar146 = vfnmadd213ps_fma(auVar46,auVar99,ZEXT1632(auVar20));
          auVar161 = vfnmadd231ps_fma(auVar93,auVar99,auVar109);
          auVar93 = vsubps_avx512vl(auVar105,ZEXT1632(auVar90));
          auVar109 = vsubps_avx(ZEXT1632(auVar85),ZEXT1632(auVar88));
          auVar110 = vsubps_avx(ZEXT1632(auVar81),ZEXT1632(auVar89));
          auVar47._4_4_ = auVar109._4_4_ * auVar89._4_4_;
          auVar47._0_4_ = auVar109._0_4_ * auVar89._0_4_;
          auVar47._8_4_ = auVar109._8_4_ * auVar89._8_4_;
          auVar47._12_4_ = auVar109._12_4_ * auVar89._12_4_;
          auVar47._16_4_ = auVar109._16_4_ * 0.0;
          auVar47._20_4_ = auVar109._20_4_ * 0.0;
          auVar47._24_4_ = auVar109._24_4_ * 0.0;
          auVar47._28_4_ = auVar106._28_4_;
          auVar147 = vfmsub231ps_fma(auVar47,ZEXT1632(auVar88),auVar110);
          auVar48._4_4_ = auVar110._4_4_ * auVar90._4_4_;
          auVar48._0_4_ = auVar110._0_4_ * auVar90._0_4_;
          auVar48._8_4_ = auVar110._8_4_ * auVar90._8_4_;
          auVar48._12_4_ = auVar110._12_4_ * auVar90._12_4_;
          auVar48._16_4_ = auVar110._16_4_ * 0.0;
          auVar48._20_4_ = auVar110._20_4_ * 0.0;
          auVar48._24_4_ = auVar110._24_4_ * 0.0;
          auVar48._28_4_ = auVar110._28_4_;
          auVar20 = vfmsub231ps_fma(auVar48,ZEXT1632(auVar89),auVar93);
          auVar49._4_4_ = auVar88._4_4_ * auVar93._4_4_;
          auVar49._0_4_ = auVar88._0_4_ * auVar93._0_4_;
          auVar49._8_4_ = auVar88._8_4_ * auVar93._8_4_;
          auVar49._12_4_ = auVar88._12_4_ * auVar93._12_4_;
          auVar49._16_4_ = auVar93._16_4_ * 0.0;
          auVar49._20_4_ = auVar93._20_4_ * 0.0;
          auVar49._24_4_ = auVar93._24_4_ * 0.0;
          auVar49._28_4_ = auVar93._28_4_;
          auVar87 = vfmsub231ps_fma(auVar49,ZEXT1632(auVar90),auVar109);
          auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar95,ZEXT1632(auVar20));
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar95,ZEXT1632(auVar147));
          auVar101 = ZEXT1632(auVar92);
          uVar70 = vcmpps_avx512vl(auVar109,auVar101,2);
          bVar69 = (byte)uVar70;
          fVar136 = (float)((uint)(bVar69 & 1) * auVar91._0_4_ |
                           (uint)!(bool)(bVar69 & 1) * auVar145._0_4_);
          bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
          fVar138 = (float)((uint)bVar13 * auVar91._4_4_ | (uint)!bVar13 * auVar145._4_4_);
          bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
          fVar140 = (float)((uint)bVar13 * auVar91._8_4_ | (uint)!bVar13 * auVar145._8_4_);
          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
          fVar142 = (float)((uint)bVar13 * auVar91._12_4_ | (uint)!bVar13 * auVar145._12_4_);
          auVar95 = ZEXT1632(CONCAT412(fVar142,CONCAT48(fVar140,CONCAT44(fVar138,fVar136))));
          fVar137 = (float)((uint)(bVar69 & 1) * auVar86._0_4_ |
                           (uint)!(bool)(bVar69 & 1) * auVar146._0_4_);
          bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
          fVar139 = (float)((uint)bVar13 * auVar86._4_4_ | (uint)!bVar13 * auVar146._4_4_);
          bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
          fVar141 = (float)((uint)bVar13 * auVar86._8_4_ | (uint)!bVar13 * auVar146._8_4_);
          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
          fVar143 = (float)((uint)bVar13 * auVar86._12_4_ | (uint)!bVar13 * auVar146._12_4_);
          auVar96 = ZEXT1632(CONCAT412(fVar143,CONCAT48(fVar141,CONCAT44(fVar139,fVar137))));
          auVar127._0_4_ =
               (float)((uint)(bVar69 & 1) * auVar107._0_4_ |
                      (uint)!(bool)(bVar69 & 1) * auVar161._0_4_);
          bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar127._4_4_ = (float)((uint)bVar13 * auVar107._4_4_ | (uint)!bVar13 * auVar161._4_4_);
          bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar127._8_4_ = (float)((uint)bVar13 * auVar107._8_4_ | (uint)!bVar13 * auVar161._8_4_);
          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar127._12_4_ =
               (float)((uint)bVar13 * auVar107._12_4_ | (uint)!bVar13 * auVar161._12_4_);
          fVar159 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar107._16_4_);
          auVar127._16_4_ = fVar159;
          fVar166 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar107._20_4_);
          auVar127._20_4_ = fVar166;
          fVar158 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar107._24_4_);
          auVar127._24_4_ = fVar158;
          iVar1 = (uint)(byte)(uVar70 >> 7) * auVar107._28_4_;
          auVar127._28_4_ = iVar1;
          auVar109 = vblendmps_avx512vl(ZEXT1632(auVar90),auVar105);
          auVar128._0_4_ =
               (uint)(bVar69 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar147._0_4_;
          bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar128._4_4_ = (uint)bVar13 * auVar109._4_4_ | (uint)!bVar13 * auVar147._4_4_;
          bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar128._8_4_ = (uint)bVar13 * auVar109._8_4_ | (uint)!bVar13 * auVar147._8_4_;
          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar128._12_4_ = (uint)bVar13 * auVar109._12_4_ | (uint)!bVar13 * auVar147._12_4_;
          auVar128._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * auVar109._16_4_;
          auVar128._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * auVar109._20_4_;
          auVar128._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * auVar109._24_4_;
          auVar128._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar109._28_4_;
          auVar109 = vblendmps_avx512vl(ZEXT1632(auVar88),ZEXT1632(auVar85));
          auVar129._0_4_ =
               (float)((uint)(bVar69 & 1) * auVar109._0_4_ |
                      (uint)!(bool)(bVar69 & 1) * auVar91._0_4_);
          bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar129._4_4_ = (float)((uint)bVar13 * auVar109._4_4_ | (uint)!bVar13 * auVar91._4_4_);
          bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar129._8_4_ = (float)((uint)bVar13 * auVar109._8_4_ | (uint)!bVar13 * auVar91._8_4_);
          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar129._12_4_ = (float)((uint)bVar13 * auVar109._12_4_ | (uint)!bVar13 * auVar91._12_4_)
          ;
          fVar160 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar109._16_4_);
          auVar129._16_4_ = fVar160;
          fVar173 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar109._20_4_);
          auVar129._20_4_ = fVar173;
          fVar172 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar109._24_4_);
          auVar129._24_4_ = fVar172;
          auVar129._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar109._28_4_;
          auVar109 = vblendmps_avx512vl(ZEXT1632(auVar89),ZEXT1632(auVar81));
          auVar130._0_4_ =
               (float)((uint)(bVar69 & 1) * auVar109._0_4_ |
                      (uint)!(bool)(bVar69 & 1) * auVar86._0_4_);
          bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar130._4_4_ = (float)((uint)bVar13 * auVar109._4_4_ | (uint)!bVar13 * auVar86._4_4_);
          bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar130._8_4_ = (float)((uint)bVar13 * auVar109._8_4_ | (uint)!bVar13 * auVar86._8_4_);
          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar130._12_4_ = (float)((uint)bVar13 * auVar109._12_4_ | (uint)!bVar13 * auVar86._12_4_)
          ;
          fVar190 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar109._16_4_);
          auVar130._16_4_ = fVar190;
          fVar79 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar109._20_4_);
          auVar130._20_4_ = fVar79;
          fVar80 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar109._24_4_);
          auVar130._24_4_ = fVar80;
          iVar2 = (uint)(byte)(uVar70 >> 7) * auVar109._28_4_;
          auVar130._28_4_ = iVar2;
          auVar131._0_4_ =
               (uint)(bVar69 & 1) * (int)auVar90._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar105._0_4_;
          bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar131._4_4_ = (uint)bVar13 * (int)auVar90._4_4_ | (uint)!bVar13 * auVar105._4_4_;
          bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar131._8_4_ = (uint)bVar13 * (int)auVar90._8_4_ | (uint)!bVar13 * auVar105._8_4_;
          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar131._12_4_ = (uint)bVar13 * (int)auVar90._12_4_ | (uint)!bVar13 * auVar105._12_4_;
          auVar131._16_4_ = (uint)!(bool)((byte)(uVar70 >> 4) & 1) * auVar105._16_4_;
          auVar131._20_4_ = (uint)!(bool)((byte)(uVar70 >> 5) & 1) * auVar105._20_4_;
          auVar131._24_4_ = (uint)!(bool)((byte)(uVar70 >> 6) & 1) * auVar105._24_4_;
          auVar131._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar105._28_4_;
          bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar70 >> 3) & 1);
          bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar70 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar105 = vsubps_avx512vl(auVar131,auVar95);
          auVar110 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar88._12_4_ |
                                                   (uint)!bVar17 * auVar85._12_4_,
                                                   CONCAT48((uint)bVar15 * (int)auVar88._8_4_ |
                                                            (uint)!bVar15 * auVar85._8_4_,
                                                            CONCAT44((uint)bVar13 *
                                                                     (int)auVar88._4_4_ |
                                                                     (uint)!bVar13 * auVar85._4_4_,
                                                                     (uint)(bVar69 & 1) *
                                                                     (int)auVar88._0_4_ |
                                                                     (uint)!(bool)(bVar69 & 1) *
                                                                     auVar85._0_4_)))),auVar96);
          auVar209 = ZEXT3264(auVar110);
          auVar107 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar89._12_4_ |
                                                   (uint)!bVar18 * auVar81._12_4_,
                                                   CONCAT48((uint)bVar16 * (int)auVar89._8_4_ |
                                                            (uint)!bVar16 * auVar81._8_4_,
                                                            CONCAT44((uint)bVar14 *
                                                                     (int)auVar89._4_4_ |
                                                                     (uint)!bVar14 * auVar81._4_4_,
                                                                     (uint)(bVar69 & 1) *
                                                                     (int)auVar89._0_4_ |
                                                                     (uint)!(bool)(bVar69 & 1) *
                                                                     auVar81._0_4_)))),auVar127);
          auVar106 = vsubps_avx(auVar95,auVar128);
          auVar213 = ZEXT3264(auVar106);
          auVar93 = vsubps_avx(auVar96,auVar129);
          auVar94 = vsubps_avx(auVar127,auVar130);
          auVar50._4_4_ = auVar107._4_4_ * fVar138;
          auVar50._0_4_ = auVar107._0_4_ * fVar136;
          auVar50._8_4_ = auVar107._8_4_ * fVar140;
          auVar50._12_4_ = auVar107._12_4_ * fVar142;
          auVar50._16_4_ = auVar107._16_4_ * 0.0;
          auVar50._20_4_ = auVar107._20_4_ * 0.0;
          auVar50._24_4_ = auVar107._24_4_ * 0.0;
          auVar50._28_4_ = 0;
          auVar85 = vfmsub231ps_fma(auVar50,auVar127,auVar105);
          auVar188._0_4_ = fVar137 * auVar105._0_4_;
          auVar188._4_4_ = fVar139 * auVar105._4_4_;
          auVar188._8_4_ = fVar141 * auVar105._8_4_;
          auVar188._12_4_ = fVar143 * auVar105._12_4_;
          auVar188._16_4_ = auVar105._16_4_ * 0.0;
          auVar188._20_4_ = auVar105._20_4_ * 0.0;
          auVar188._24_4_ = auVar105._24_4_ * 0.0;
          auVar188._28_4_ = 0;
          auVar81 = vfmsub231ps_fma(auVar188,auVar95,auVar110);
          auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar101,ZEXT1632(auVar85));
          auVar195._0_4_ = auVar110._0_4_ * auVar127._0_4_;
          auVar195._4_4_ = auVar110._4_4_ * auVar127._4_4_;
          auVar195._8_4_ = auVar110._8_4_ * auVar127._8_4_;
          auVar195._12_4_ = auVar110._12_4_ * auVar127._12_4_;
          auVar195._16_4_ = auVar110._16_4_ * fVar159;
          auVar195._20_4_ = auVar110._20_4_ * fVar166;
          auVar195._24_4_ = auVar110._24_4_ * fVar158;
          auVar195._28_4_ = 0;
          auVar85 = vfmsub231ps_fma(auVar195,auVar96,auVar107);
          auVar97 = vfmadd231ps_avx512vl(auVar109,auVar101,ZEXT1632(auVar85));
          auVar109 = vmulps_avx512vl(auVar94,auVar128);
          auVar109 = vfmsub231ps_avx512vl(auVar109,auVar106,auVar130);
          auVar51._4_4_ = auVar93._4_4_ * auVar130._4_4_;
          auVar51._0_4_ = auVar93._0_4_ * auVar130._0_4_;
          auVar51._8_4_ = auVar93._8_4_ * auVar130._8_4_;
          auVar51._12_4_ = auVar93._12_4_ * auVar130._12_4_;
          auVar51._16_4_ = auVar93._16_4_ * fVar190;
          auVar51._20_4_ = auVar93._20_4_ * fVar79;
          auVar51._24_4_ = auVar93._24_4_ * fVar80;
          auVar51._28_4_ = iVar2;
          auVar85 = vfmsub231ps_fma(auVar51,auVar129,auVar94);
          auVar196._0_4_ = auVar129._0_4_ * auVar106._0_4_;
          auVar196._4_4_ = auVar129._4_4_ * auVar106._4_4_;
          auVar196._8_4_ = auVar129._8_4_ * auVar106._8_4_;
          auVar196._12_4_ = auVar129._12_4_ * auVar106._12_4_;
          auVar196._16_4_ = fVar160 * auVar106._16_4_;
          auVar196._20_4_ = fVar173 * auVar106._20_4_;
          auVar196._24_4_ = fVar172 * auVar106._24_4_;
          auVar196._28_4_ = 0;
          auVar81 = vfmsub231ps_fma(auVar196,auVar93,auVar128);
          auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar101,auVar109);
          auVar100 = vfmadd231ps_avx512vl(auVar109,auVar101,ZEXT1632(auVar85));
          auVar198 = ZEXT3264(auVar100);
          auVar109 = vmaxps_avx(auVar97,auVar100);
          uVar24 = vcmpps_avx512vl(auVar109,auVar101,2);
          bVar78 = bVar78 & (byte)uVar24;
          if (bVar78 != 0) {
            auVar52._4_4_ = auVar94._4_4_ * auVar110._4_4_;
            auVar52._0_4_ = auVar94._0_4_ * auVar110._0_4_;
            auVar52._8_4_ = auVar94._8_4_ * auVar110._8_4_;
            auVar52._12_4_ = auVar94._12_4_ * auVar110._12_4_;
            auVar52._16_4_ = auVar94._16_4_ * auVar110._16_4_;
            auVar52._20_4_ = auVar94._20_4_ * auVar110._20_4_;
            auVar52._24_4_ = auVar94._24_4_ * auVar110._24_4_;
            auVar52._28_4_ = auVar109._28_4_;
            auVar20 = vfmsub231ps_fma(auVar52,auVar93,auVar107);
            auVar53._4_4_ = auVar107._4_4_ * auVar106._4_4_;
            auVar53._0_4_ = auVar107._0_4_ * auVar106._0_4_;
            auVar53._8_4_ = auVar107._8_4_ * auVar106._8_4_;
            auVar53._12_4_ = auVar107._12_4_ * auVar106._12_4_;
            auVar53._16_4_ = auVar107._16_4_ * auVar106._16_4_;
            auVar53._20_4_ = auVar107._20_4_ * auVar106._20_4_;
            auVar53._24_4_ = auVar107._24_4_ * auVar106._24_4_;
            auVar53._28_4_ = auVar107._28_4_;
            auVar147 = vfmsub231ps_fma(auVar53,auVar105,auVar94);
            auVar54._4_4_ = auVar93._4_4_ * auVar105._4_4_;
            auVar54._0_4_ = auVar93._0_4_ * auVar105._0_4_;
            auVar54._8_4_ = auVar93._8_4_ * auVar105._8_4_;
            auVar54._12_4_ = auVar93._12_4_ * auVar105._12_4_;
            auVar54._16_4_ = auVar93._16_4_ * auVar105._16_4_;
            auVar54._20_4_ = auVar93._20_4_ * auVar105._20_4_;
            auVar54._24_4_ = auVar93._24_4_ * auVar105._24_4_;
            auVar54._28_4_ = auVar93._28_4_;
            auVar91 = vfmsub231ps_fma(auVar54,auVar106,auVar110);
            auVar85 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar147),ZEXT1632(auVar91));
            auVar81 = vfmadd231ps_fma(ZEXT1632(auVar85),ZEXT1632(auVar20),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar109 = vrcp14ps_avx512vl(ZEXT1632(auVar81));
            auVar213 = ZEXT3264(auVar109);
            auVar31._8_4_ = 0x3f800000;
            auVar31._0_8_ = 0x3f8000003f800000;
            auVar31._12_4_ = 0x3f800000;
            auVar31._16_4_ = 0x3f800000;
            auVar31._20_4_ = 0x3f800000;
            auVar31._24_4_ = 0x3f800000;
            auVar31._28_4_ = 0x3f800000;
            auVar110 = vfnmadd213ps_avx512vl(auVar109,ZEXT1632(auVar81),auVar31);
            auVar85 = vfmadd132ps_fma(auVar110,auVar109,auVar109);
            auVar209 = ZEXT1664(auVar85);
            auVar55._4_4_ = auVar91._4_4_ * auVar127._4_4_;
            auVar55._0_4_ = auVar91._0_4_ * auVar127._0_4_;
            auVar55._8_4_ = auVar91._8_4_ * auVar127._8_4_;
            auVar55._12_4_ = auVar91._12_4_ * auVar127._12_4_;
            auVar55._16_4_ = fVar159 * 0.0;
            auVar55._20_4_ = fVar166 * 0.0;
            auVar55._24_4_ = fVar158 * 0.0;
            auVar55._28_4_ = iVar1;
            auVar147 = vfmadd231ps_fma(auVar55,auVar96,ZEXT1632(auVar147));
            auVar147 = vfmadd231ps_fma(ZEXT1632(auVar147),auVar95,ZEXT1632(auVar20));
            fVar166 = auVar85._0_4_;
            fVar158 = auVar85._4_4_;
            fVar159 = auVar85._8_4_;
            fVar160 = auVar85._12_4_;
            local_3c0 = ZEXT1632(CONCAT412(auVar147._12_4_ * fVar160,
                                           CONCAT48(auVar147._8_4_ * fVar159,
                                                    CONCAT44(auVar147._4_4_ * fVar158,
                                                             auVar147._0_4_ * fVar166))));
            auVar220 = ZEXT3264(local_3c0);
            auVar68._4_4_ = uStack_51c;
            auVar68._0_4_ = local_520;
            auVar68._8_4_ = uStack_518;
            auVar68._12_4_ = uStack_514;
            auVar68._16_4_ = uStack_510;
            auVar68._20_4_ = uStack_50c;
            auVar68._24_4_ = uStack_508;
            auVar68._28_4_ = uStack_504;
            uVar24 = vcmpps_avx512vl(local_3c0,auVar68,0xd);
            uVar144 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar32._4_4_ = uVar144;
            auVar32._0_4_ = uVar144;
            auVar32._8_4_ = uVar144;
            auVar32._12_4_ = uVar144;
            auVar32._16_4_ = uVar144;
            auVar32._20_4_ = uVar144;
            auVar32._24_4_ = uVar144;
            auVar32._28_4_ = uVar144;
            uVar25 = vcmpps_avx512vl(local_3c0,auVar32,2);
            bVar78 = (byte)uVar24 & (byte)uVar25 & bVar78;
            if (bVar78 != 0) {
              uVar76 = vcmpps_avx512vl(ZEXT1632(auVar81),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar76 = bVar78 & uVar76;
              if ((char)uVar76 != '\0') {
                fVar173 = auVar97._0_4_ * fVar166;
                fVar172 = auVar97._4_4_ * fVar158;
                auVar56._4_4_ = fVar172;
                auVar56._0_4_ = fVar173;
                fVar190 = auVar97._8_4_ * fVar159;
                auVar56._8_4_ = fVar190;
                fVar79 = auVar97._12_4_ * fVar160;
                auVar56._12_4_ = fVar79;
                fVar80 = auVar97._16_4_ * 0.0;
                auVar56._16_4_ = fVar80;
                fVar136 = auVar97._20_4_ * 0.0;
                auVar56._20_4_ = fVar136;
                fVar137 = auVar97._24_4_ * 0.0;
                auVar56._24_4_ = fVar137;
                auVar56._28_4_ = auVar97._28_4_;
                auVar171._8_4_ = 0x3f800000;
                auVar171._0_8_ = 0x3f8000003f800000;
                auVar171._12_4_ = 0x3f800000;
                auVar171._16_4_ = 0x3f800000;
                auVar171._20_4_ = 0x3f800000;
                auVar171._24_4_ = 0x3f800000;
                auVar171._28_4_ = 0x3f800000;
                auVar109 = vsubps_avx(auVar171,auVar56);
                local_400._0_4_ =
                     (float)((uint)(bVar69 & 1) * (int)fVar173 |
                            (uint)!(bool)(bVar69 & 1) * auVar109._0_4_);
                bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
                local_400._4_4_ =
                     (float)((uint)bVar13 * (int)fVar172 | (uint)!bVar13 * auVar109._4_4_);
                bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
                local_400._8_4_ =
                     (float)((uint)bVar13 * (int)fVar190 | (uint)!bVar13 * auVar109._8_4_);
                bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
                local_400._12_4_ =
                     (float)((uint)bVar13 * (int)fVar79 | (uint)!bVar13 * auVar109._12_4_);
                bVar13 = (bool)((byte)(uVar70 >> 4) & 1);
                local_400._16_4_ =
                     (float)((uint)bVar13 * (int)fVar80 | (uint)!bVar13 * auVar109._16_4_);
                bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
                local_400._20_4_ =
                     (float)((uint)bVar13 * (int)fVar136 | (uint)!bVar13 * auVar109._20_4_);
                bVar13 = (bool)((byte)(uVar70 >> 6) & 1);
                local_400._24_4_ =
                     (float)((uint)bVar13 * (int)fVar137 | (uint)!bVar13 * auVar109._24_4_);
                bVar13 = SUB81(uVar70 >> 7,0);
                local_400._28_4_ =
                     (float)((uint)bVar13 * auVar97._28_4_ | (uint)!bVar13 * auVar109._28_4_);
                auVar109 = vsubps_avx(auVar99,auVar98);
                auVar85 = vfmadd213ps_fma(auVar109,local_400,auVar98);
                uVar144 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
                auVar33._4_4_ = uVar144;
                auVar33._0_4_ = uVar144;
                auVar33._8_4_ = uVar144;
                auVar33._12_4_ = uVar144;
                auVar33._16_4_ = uVar144;
                auVar33._20_4_ = uVar144;
                auVar33._24_4_ = uVar144;
                auVar33._28_4_ = uVar144;
                auVar109 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar85._12_4_ + auVar85._12_4_,
                                                              CONCAT48(auVar85._8_4_ + auVar85._8_4_
                                                                       ,CONCAT44(auVar85._4_4_ +
                                                                                 auVar85._4_4_,
                                                                                 auVar85._0_4_ +
                                                                                 auVar85._0_4_)))),
                                           auVar33);
                uVar26 = vcmpps_avx512vl(local_3c0,auVar109,6);
                uVar76 = uVar76 & uVar26;
                bVar78 = (byte)uVar76;
                if (bVar78 != 0) {
                  auVar165._0_4_ = auVar100._0_4_ * fVar166;
                  auVar165._4_4_ = auVar100._4_4_ * fVar158;
                  auVar165._8_4_ = auVar100._8_4_ * fVar159;
                  auVar165._12_4_ = auVar100._12_4_ * fVar160;
                  auVar165._16_4_ = auVar100._16_4_ * 0.0;
                  auVar165._20_4_ = auVar100._20_4_ * 0.0;
                  auVar165._24_4_ = auVar100._24_4_ * 0.0;
                  auVar165._28_4_ = 0;
                  auVar189._8_4_ = 0x3f800000;
                  auVar189._0_8_ = 0x3f8000003f800000;
                  auVar189._12_4_ = 0x3f800000;
                  auVar189._16_4_ = 0x3f800000;
                  auVar189._20_4_ = 0x3f800000;
                  auVar189._24_4_ = 0x3f800000;
                  auVar189._28_4_ = 0x3f800000;
                  auVar109 = vsubps_avx(auVar189,auVar165);
                  auVar132._0_4_ =
                       (uint)(bVar69 & 1) * (int)auVar165._0_4_ |
                       (uint)!(bool)(bVar69 & 1) * auVar109._0_4_;
                  bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
                  auVar132._4_4_ =
                       (uint)bVar13 * (int)auVar165._4_4_ | (uint)!bVar13 * auVar109._4_4_;
                  bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
                  auVar132._8_4_ =
                       (uint)bVar13 * (int)auVar165._8_4_ | (uint)!bVar13 * auVar109._8_4_;
                  bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
                  auVar132._12_4_ =
                       (uint)bVar13 * (int)auVar165._12_4_ | (uint)!bVar13 * auVar109._12_4_;
                  bVar13 = (bool)((byte)(uVar70 >> 4) & 1);
                  auVar132._16_4_ =
                       (uint)bVar13 * (int)auVar165._16_4_ | (uint)!bVar13 * auVar109._16_4_;
                  bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
                  auVar132._20_4_ =
                       (uint)bVar13 * (int)auVar165._20_4_ | (uint)!bVar13 * auVar109._20_4_;
                  bVar13 = (bool)((byte)(uVar70 >> 6) & 1);
                  auVar132._24_4_ =
                       (uint)bVar13 * (int)auVar165._24_4_ | (uint)!bVar13 * auVar109._24_4_;
                  auVar132._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar109._28_4_;
                  auVar34._8_4_ = 0x40000000;
                  auVar34._0_8_ = 0x4000000040000000;
                  auVar34._12_4_ = 0x40000000;
                  auVar34._16_4_ = 0x40000000;
                  auVar34._20_4_ = 0x40000000;
                  auVar34._24_4_ = 0x40000000;
                  auVar34._28_4_ = 0x40000000;
                  local_3e0 = vfmsub132ps_avx512vl(auVar132,auVar189,auVar34);
                  local_3a0 = (undefined4)lVar72;
                  pGVar73 = (context->scene->geometries).items[uVar8].ptr;
                  if ((pGVar73->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                    uVar77 = (uint)uVar76;
                    auVar85 = vcvtsi2ss_avx512f(auVar92,local_3a0);
                    fVar166 = auVar85._0_4_;
                    local_340[0] = (fVar166 + local_400._0_4_ + 0.0) * local_100;
                    local_340[1] = (fVar166 + local_400._4_4_ + 1.0) * fStack_fc;
                    local_340[2] = (fVar166 + local_400._8_4_ + 2.0) * fStack_f8;
                    local_340[3] = (fVar166 + local_400._12_4_ + 3.0) * fStack_f4;
                    fStack_330 = (fVar166 + local_400._16_4_ + 4.0) * fStack_f0;
                    fStack_32c = (fVar166 + local_400._20_4_ + 5.0) * fStack_ec;
                    fStack_328 = (fVar166 + local_400._24_4_ + 6.0) * fStack_e8;
                    fStack_324 = fVar166 + local_400._28_4_ + 7.0;
                    local_320 = local_3e0;
                    local_300 = local_3c0;
                    auVar153._8_4_ = 0x7f800000;
                    auVar153._0_8_ = 0x7f8000007f800000;
                    auVar153._12_4_ = 0x7f800000;
                    auVar153._16_4_ = 0x7f800000;
                    auVar153._20_4_ = 0x7f800000;
                    auVar153._24_4_ = 0x7f800000;
                    auVar153._28_4_ = 0x7f800000;
                    auVar109 = vblendmps_avx512vl(auVar153,local_3c0);
                    auVar133._0_4_ =
                         (uint)(bVar78 & 1) * auVar109._0_4_ |
                         (uint)!(bool)(bVar78 & 1) * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar76 >> 1) & 1);
                    auVar133._4_4_ = (uint)bVar13 * auVar109._4_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar76 >> 2) & 1);
                    auVar133._8_4_ = (uint)bVar13 * auVar109._8_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar76 >> 3) & 1);
                    auVar133._12_4_ = (uint)bVar13 * auVar109._12_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar76 >> 4) & 1);
                    auVar133._16_4_ = (uint)bVar13 * auVar109._16_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar76 >> 5) & 1);
                    auVar133._20_4_ = (uint)bVar13 * auVar109._20_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar76 >> 6) & 1);
                    auVar133._24_4_ = (uint)bVar13 * auVar109._24_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = SUB81(uVar76 >> 7,0);
                    auVar133._28_4_ = (uint)bVar13 * auVar109._28_4_ | (uint)!bVar13 * 0x7f800000;
                    auVar109 = vshufps_avx(auVar133,auVar133,0xb1);
                    auVar109 = vminps_avx(auVar133,auVar109);
                    auVar110 = vshufpd_avx(auVar109,auVar109,5);
                    auVar109 = vminps_avx(auVar109,auVar110);
                    auVar110 = vpermpd_avx2(auVar109,0x4e);
                    auVar109 = vminps_avx(auVar109,auVar110);
                    uVar24 = vcmpps_avx512vl(auVar133,auVar109,0);
                    if ((bVar78 & (byte)uVar24) != 0) {
                      uVar77 = (uint)(bVar78 & (byte)uVar24);
                    }
                    uVar71 = 0;
                    for (; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x80000000) {
                      uVar71 = uVar71 + 1;
                    }
                    uVar70 = (ulong)uVar71;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar73->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_120 = vmovdqa64_avx512vl(auVar227._0_32_);
                      local_640 = ZEXT416(*(uint *)(ray + k * 4 + 0x100));
                      local_5c0._0_8_ = pGVar73;
                      local_5a0 = local_3c0;
                      local_39c = iVar10;
                      local_390 = auVar84;
                      local_380 = uVar23;
                      uStack_378 = uVar27;
                      local_370 = uVar62;
                      uStack_368 = uVar63;
                      local_360 = uVar64;
                      uStack_358 = uVar65;
                      do {
                        fVar166 = local_340[uVar70];
                        auVar163._4_4_ = fVar166;
                        auVar163._0_4_ = fVar166;
                        auVar163._8_4_ = fVar166;
                        auVar163._12_4_ = fVar166;
                        local_1e0._16_4_ = fVar166;
                        local_1e0._0_16_ = auVar163;
                        local_1e0._20_4_ = fVar166;
                        local_1e0._24_4_ = fVar166;
                        local_1e0._28_4_ = fVar166;
                        local_1c0 = *(undefined4 *)(local_320 + uVar70 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)(local_300 + uVar70 * 4);
                        local_670.context = context->user;
                        fVar158 = 1.0 - fVar166;
                        auVar20 = vfnmadd231ss_fma(ZEXT416((uint)(fVar166 * (fVar158 + fVar158))),
                                                   ZEXT416((uint)fVar158),ZEXT416((uint)fVar158));
                        auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar163,
                                                  ZEXT416(0xc0a00000));
                        auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar166 * fVar166 * 3.0)),
                                                  ZEXT416((uint)(fVar166 + fVar166)),auVar85);
                        auVar213 = ZEXT1664(auVar81);
                        auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar163,
                                                  ZEXT416(0x40000000));
                        auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar158 * fVar158 * -3.0)),
                                                  ZEXT416((uint)(fVar158 + fVar158)),auVar85);
                        auVar147 = vfmadd231ss_fma(ZEXT416((uint)(fVar166 * fVar166)),auVar163,
                                                   ZEXT416((uint)(fVar158 * -2.0)));
                        fVar166 = auVar20._0_4_ * 0.5;
                        fVar158 = auVar81._0_4_ * 0.5;
                        fVar159 = auVar85._0_4_ * 0.5;
                        fVar160 = auVar147._0_4_ * 0.5;
                        auVar183._0_4_ = fVar160 * local_6d0;
                        auVar183._4_4_ = fVar160 * fStack_6cc;
                        auVar183._8_4_ = fVar160 * fStack_6c8;
                        auVar183._12_4_ = fVar160 * fStack_6c4;
                        auVar203._4_4_ = fVar159;
                        auVar203._0_4_ = fVar159;
                        auVar203._8_4_ = fVar159;
                        auVar203._12_4_ = fVar159;
                        auVar85 = vfmadd132ps_fma(auVar203,auVar183,auVar22);
                        auVar184._4_4_ = fVar158;
                        auVar184._0_4_ = fVar158;
                        auVar184._8_4_ = fVar158;
                        auVar184._12_4_ = fVar158;
                        auVar85 = vfmadd132ps_fma(auVar184,auVar85,auVar83);
                        auVar148._4_4_ = fVar166;
                        auVar148._0_4_ = fVar166;
                        auVar148._8_4_ = fVar166;
                        auVar148._12_4_ = fVar166;
                        auVar85 = vfmadd213ps_fma(auVar148,auVar84,auVar85);
                        local_240 = auVar85._0_4_;
                        auVar197._8_4_ = 1;
                        auVar197._0_8_ = 0x100000001;
                        auVar197._12_4_ = 1;
                        auVar197._16_4_ = 1;
                        auVar197._20_4_ = 1;
                        auVar197._24_4_ = 1;
                        auVar197._28_4_ = 1;
                        local_220 = vpermps_avx2(auVar197,ZEXT1632(auVar85));
                        auVar198 = ZEXT3264(local_220);
                        auVar204._8_4_ = 2;
                        auVar204._0_8_ = 0x200000002;
                        auVar204._12_4_ = 2;
                        auVar207._16_4_ = 2;
                        auVar207._0_16_ = auVar204;
                        auVar207._20_4_ = 2;
                        auVar207._24_4_ = 2;
                        auVar207._28_4_ = 2;
                        auVar209 = ZEXT3264(auVar207);
                        local_200 = vpermps_avx2(auVar207,ZEXT1632(auVar85));
                        iStack_23c = local_240;
                        iStack_238 = local_240;
                        iStack_234 = local_240;
                        iStack_230 = local_240;
                        iStack_22c = local_240;
                        iStack_228 = local_240;
                        iStack_224 = local_240;
                        uStack_1bc = local_1c0;
                        uStack_1b8 = local_1c0;
                        uStack_1b4 = local_1c0;
                        uStack_1b0 = local_1c0;
                        uStack_1ac = local_1c0;
                        uStack_1a8 = local_1c0;
                        uStack_1a4 = local_1c0;
                        local_1a0 = local_2a0._0_8_;
                        uStack_198 = local_2a0._8_8_;
                        uStack_190 = local_2a0._16_8_;
                        uStack_188 = local_2a0._24_8_;
                        local_180 = local_280;
                        auVar109 = vpcmpeqd_avx2(local_280,local_280);
                        local_628[1] = auVar109;
                        *local_628 = auVar109;
                        local_160 = (local_670.context)->instID[0];
                        uStack_15c = local_160;
                        uStack_158 = local_160;
                        uStack_154 = local_160;
                        uStack_150 = local_160;
                        uStack_14c = local_160;
                        uStack_148 = local_160;
                        uStack_144 = local_160;
                        local_140 = (local_670.context)->instPrimID[0];
                        uStack_13c = local_140;
                        uStack_138 = local_140;
                        uStack_134 = local_140;
                        uStack_130 = local_140;
                        uStack_12c = local_140;
                        uStack_128 = local_140;
                        uStack_124 = local_140;
                        local_620 = local_2c0;
                        local_670.valid = (int *)local_620;
                        local_670.geometryUserPtr = pGVar73->userPtr;
                        local_670.hit = (RTCHitN *)&local_240;
                        local_670.N = 8;
                        local_670.ray = (RTCRayN *)ray;
                        if (pGVar73->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar198 = ZEXT1664(local_220._0_16_);
                          auVar209 = ZEXT1664(auVar204);
                          auVar213 = ZEXT1664(auVar81);
                          (*pGVar73->intersectionFilterN)(&local_670);
                          auVar220 = ZEXT3264(local_5a0);
                          pGVar73 = (Geometry *)local_5c0._0_8_;
                        }
                        if (local_620 == (undefined1  [32])0x0) {
LAB_01806f98:
                          *(undefined4 *)(ray + k * 4 + 0x100) = local_640._0_4_;
                        }
                        else {
                          p_Var12 = context->args->filter;
                          if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar73->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar198 = ZEXT1664(auVar198._0_16_);
                            auVar209 = ZEXT1664(auVar209._0_16_);
                            auVar213 = ZEXT1664(auVar213._0_16_);
                            (*p_Var12)(&local_670);
                            auVar220 = ZEXT3264(local_5a0);
                            pGVar73 = (Geometry *)local_5c0._0_8_;
                          }
                          if (local_620 == (undefined1  [32])0x0) goto LAB_01806f98;
                          uVar26 = vptestmd_avx512vl(local_620,local_620);
                          iVar1 = *(int *)(local_670.hit + 4);
                          iVar2 = *(int *)(local_670.hit + 8);
                          iVar57 = *(int *)(local_670.hit + 0xc);
                          iVar58 = *(int *)(local_670.hit + 0x10);
                          iVar59 = *(int *)(local_670.hit + 0x14);
                          iVar60 = *(int *)(local_670.hit + 0x18);
                          iVar61 = *(int *)(local_670.hit + 0x1c);
                          bVar78 = (byte)uVar26;
                          bVar13 = (bool)((byte)(uVar26 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar26 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar26 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar26 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar26 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar26 >> 6) & 1);
                          bVar19 = SUB81(uVar26 >> 7,0);
                          *(uint *)(local_670.ray + 0x180) =
                               (uint)(bVar78 & 1) * *(int *)local_670.hit |
                               (uint)!(bool)(bVar78 & 1) * *(int *)(local_670.ray + 0x180);
                          *(uint *)(local_670.ray + 0x184) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_670.ray + 0x184);
                          *(uint *)(local_670.ray + 0x188) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_670.ray + 0x188);
                          *(uint *)(local_670.ray + 0x18c) =
                               (uint)bVar15 * iVar57 |
                               (uint)!bVar15 * *(int *)(local_670.ray + 0x18c);
                          *(uint *)(local_670.ray + 400) =
                               (uint)bVar16 * iVar58 | (uint)!bVar16 * *(int *)(local_670.ray + 400)
                          ;
                          *(uint *)(local_670.ray + 0x194) =
                               (uint)bVar17 * iVar59 |
                               (uint)!bVar17 * *(int *)(local_670.ray + 0x194);
                          *(uint *)(local_670.ray + 0x198) =
                               (uint)bVar18 * iVar60 |
                               (uint)!bVar18 * *(int *)(local_670.ray + 0x198);
                          *(uint *)(local_670.ray + 0x19c) =
                               (uint)bVar19 * iVar61 |
                               (uint)!bVar19 * *(int *)(local_670.ray + 0x19c);
                          iVar1 = *(int *)(local_670.hit + 0x24);
                          iVar2 = *(int *)(local_670.hit + 0x28);
                          iVar57 = *(int *)(local_670.hit + 0x2c);
                          iVar58 = *(int *)(local_670.hit + 0x30);
                          iVar59 = *(int *)(local_670.hit + 0x34);
                          iVar60 = *(int *)(local_670.hit + 0x38);
                          iVar61 = *(int *)(local_670.hit + 0x3c);
                          bVar13 = (bool)((byte)(uVar26 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar26 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar26 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar26 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar26 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar26 >> 6) & 1);
                          bVar19 = SUB81(uVar26 >> 7,0);
                          *(uint *)(local_670.ray + 0x1a0) =
                               (uint)(bVar78 & 1) * *(int *)(local_670.hit + 0x20) |
                               (uint)!(bool)(bVar78 & 1) * *(int *)(local_670.ray + 0x1a0);
                          *(uint *)(local_670.ray + 0x1a4) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_670.ray + 0x1a4);
                          *(uint *)(local_670.ray + 0x1a8) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_670.ray + 0x1a8);
                          *(uint *)(local_670.ray + 0x1ac) =
                               (uint)bVar15 * iVar57 |
                               (uint)!bVar15 * *(int *)(local_670.ray + 0x1ac);
                          *(uint *)(local_670.ray + 0x1b0) =
                               (uint)bVar16 * iVar58 |
                               (uint)!bVar16 * *(int *)(local_670.ray + 0x1b0);
                          *(uint *)(local_670.ray + 0x1b4) =
                               (uint)bVar17 * iVar59 |
                               (uint)!bVar17 * *(int *)(local_670.ray + 0x1b4);
                          *(uint *)(local_670.ray + 0x1b8) =
                               (uint)bVar18 * iVar60 |
                               (uint)!bVar18 * *(int *)(local_670.ray + 0x1b8);
                          *(uint *)(local_670.ray + 0x1bc) =
                               (uint)bVar19 * iVar61 |
                               (uint)!bVar19 * *(int *)(local_670.ray + 0x1bc);
                          iVar1 = *(int *)(local_670.hit + 0x44);
                          iVar2 = *(int *)(local_670.hit + 0x48);
                          iVar57 = *(int *)(local_670.hit + 0x4c);
                          iVar58 = *(int *)(local_670.hit + 0x50);
                          iVar59 = *(int *)(local_670.hit + 0x54);
                          iVar60 = *(int *)(local_670.hit + 0x58);
                          iVar61 = *(int *)(local_670.hit + 0x5c);
                          bVar13 = (bool)((byte)(uVar26 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar26 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar26 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar26 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar26 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar26 >> 6) & 1);
                          bVar19 = SUB81(uVar26 >> 7,0);
                          *(uint *)(local_670.ray + 0x1c0) =
                               (uint)(bVar78 & 1) * *(int *)(local_670.hit + 0x40) |
                               (uint)!(bool)(bVar78 & 1) * *(int *)(local_670.ray + 0x1c0);
                          *(uint *)(local_670.ray + 0x1c4) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_670.ray + 0x1c4);
                          *(uint *)(local_670.ray + 0x1c8) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_670.ray + 0x1c8);
                          *(uint *)(local_670.ray + 0x1cc) =
                               (uint)bVar15 * iVar57 |
                               (uint)!bVar15 * *(int *)(local_670.ray + 0x1cc);
                          *(uint *)(local_670.ray + 0x1d0) =
                               (uint)bVar16 * iVar58 |
                               (uint)!bVar16 * *(int *)(local_670.ray + 0x1d0);
                          *(uint *)(local_670.ray + 0x1d4) =
                               (uint)bVar17 * iVar59 |
                               (uint)!bVar17 * *(int *)(local_670.ray + 0x1d4);
                          *(uint *)(local_670.ray + 0x1d8) =
                               (uint)bVar18 * iVar60 |
                               (uint)!bVar18 * *(int *)(local_670.ray + 0x1d8);
                          *(uint *)(local_670.ray + 0x1dc) =
                               (uint)bVar19 * iVar61 |
                               (uint)!bVar19 * *(int *)(local_670.ray + 0x1dc);
                          iVar1 = *(int *)(local_670.hit + 100);
                          iVar2 = *(int *)(local_670.hit + 0x68);
                          iVar57 = *(int *)(local_670.hit + 0x6c);
                          iVar58 = *(int *)(local_670.hit + 0x70);
                          iVar59 = *(int *)(local_670.hit + 0x74);
                          iVar60 = *(int *)(local_670.hit + 0x78);
                          iVar61 = *(int *)(local_670.hit + 0x7c);
                          bVar13 = (bool)((byte)(uVar26 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar26 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar26 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar26 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar26 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar26 >> 6) & 1);
                          bVar19 = SUB81(uVar26 >> 7,0);
                          *(uint *)(local_670.ray + 0x1e0) =
                               (uint)(bVar78 & 1) * *(int *)(local_670.hit + 0x60) |
                               (uint)!(bool)(bVar78 & 1) * *(int *)(local_670.ray + 0x1e0);
                          *(uint *)(local_670.ray + 0x1e4) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_670.ray + 0x1e4);
                          *(uint *)(local_670.ray + 0x1e8) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_670.ray + 0x1e8);
                          *(uint *)(local_670.ray + 0x1ec) =
                               (uint)bVar15 * iVar57 |
                               (uint)!bVar15 * *(int *)(local_670.ray + 0x1ec);
                          *(uint *)(local_670.ray + 0x1f0) =
                               (uint)bVar16 * iVar58 |
                               (uint)!bVar16 * *(int *)(local_670.ray + 0x1f0);
                          *(uint *)(local_670.ray + 500) =
                               (uint)bVar17 * iVar59 | (uint)!bVar17 * *(int *)(local_670.ray + 500)
                          ;
                          *(uint *)(local_670.ray + 0x1f8) =
                               (uint)bVar18 * iVar60 |
                               (uint)!bVar18 * *(int *)(local_670.ray + 0x1f8);
                          *(uint *)(local_670.ray + 0x1fc) =
                               (uint)bVar19 * iVar61 |
                               (uint)!bVar19 * *(int *)(local_670.ray + 0x1fc);
                          iVar1 = *(int *)(local_670.hit + 0x84);
                          iVar2 = *(int *)(local_670.hit + 0x88);
                          iVar57 = *(int *)(local_670.hit + 0x8c);
                          iVar58 = *(int *)(local_670.hit + 0x90);
                          iVar59 = *(int *)(local_670.hit + 0x94);
                          iVar60 = *(int *)(local_670.hit + 0x98);
                          iVar61 = *(int *)(local_670.hit + 0x9c);
                          bVar13 = (bool)((byte)(uVar26 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar26 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar26 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar26 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar26 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar26 >> 6) & 1);
                          bVar19 = SUB81(uVar26 >> 7,0);
                          *(uint *)(local_670.ray + 0x200) =
                               (uint)(bVar78 & 1) * *(int *)(local_670.hit + 0x80) |
                               (uint)!(bool)(bVar78 & 1) * *(int *)(local_670.ray + 0x200);
                          *(uint *)(local_670.ray + 0x204) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_670.ray + 0x204);
                          *(uint *)(local_670.ray + 0x208) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_670.ray + 0x208);
                          *(uint *)(local_670.ray + 0x20c) =
                               (uint)bVar15 * iVar57 |
                               (uint)!bVar15 * *(int *)(local_670.ray + 0x20c);
                          *(uint *)(local_670.ray + 0x210) =
                               (uint)bVar16 * iVar58 |
                               (uint)!bVar16 * *(int *)(local_670.ray + 0x210);
                          *(uint *)(local_670.ray + 0x214) =
                               (uint)bVar17 * iVar59 |
                               (uint)!bVar17 * *(int *)(local_670.ray + 0x214);
                          *(uint *)(local_670.ray + 0x218) =
                               (uint)bVar18 * iVar60 |
                               (uint)!bVar18 * *(int *)(local_670.ray + 0x218);
                          *(uint *)(local_670.ray + 0x21c) =
                               (uint)bVar19 * iVar61 |
                               (uint)!bVar19 * *(int *)(local_670.ray + 0x21c);
                          auVar109 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xa0)
                                                       );
                          *(undefined1 (*) [32])(local_670.ray + 0x220) = auVar109;
                          auVar109 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xc0)
                                                       );
                          *(undefined1 (*) [32])(local_670.ray + 0x240) = auVar109;
                          auVar109 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xe0)
                                                       );
                          *(undefined1 (*) [32])(local_670.ray + 0x260) = auVar109;
                          auVar109 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                         (local_670.hit + 0x100));
                          *(undefined1 (*) [32])(local_670.ray + 0x280) = auVar109;
                          local_640._0_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
                          local_640._4_4_ = 0;
                          local_640._8_4_ = 0;
                          local_640._12_4_ = 0;
                        }
                        bVar78 = ~(byte)(1 << ((uint)uVar70 & 0x1f)) & (byte)uVar76;
                        auVar154._4_4_ = local_640._0_4_;
                        auVar154._0_4_ = local_640._0_4_;
                        auVar154._8_4_ = local_640._0_4_;
                        auVar154._12_4_ = local_640._0_4_;
                        auVar154._16_4_ = local_640._0_4_;
                        auVar154._20_4_ = local_640._0_4_;
                        auVar154._24_4_ = local_640._0_4_;
                        auVar154._28_4_ = local_640._0_4_;
                        uVar24 = vcmpps_avx512vl(auVar220._0_32_,auVar154,2);
                        if ((bVar78 & (byte)uVar24) == 0) goto LAB_01807035;
                        bVar78 = bVar78 & (byte)uVar24;
                        uVar77 = (uint)bVar78;
                        uVar76 = (ulong)uVar77;
                        auVar155._8_4_ = 0x7f800000;
                        auVar155._0_8_ = 0x7f8000007f800000;
                        auVar155._12_4_ = 0x7f800000;
                        auVar155._16_4_ = 0x7f800000;
                        auVar155._20_4_ = 0x7f800000;
                        auVar155._24_4_ = 0x7f800000;
                        auVar155._28_4_ = 0x7f800000;
                        auVar109 = vblendmps_avx512vl(auVar155,auVar220._0_32_);
                        auVar134._0_4_ =
                             (uint)(bVar78 & 1) * auVar109._0_4_ |
                             (uint)!(bool)(bVar78 & 1) * 0x7f800000;
                        bVar13 = (bool)(bVar78 >> 1 & 1);
                        auVar134._4_4_ = (uint)bVar13 * auVar109._4_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar78 >> 2 & 1);
                        auVar134._8_4_ = (uint)bVar13 * auVar109._8_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar78 >> 3 & 1);
                        auVar134._12_4_ =
                             (uint)bVar13 * auVar109._12_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar78 >> 4 & 1);
                        auVar134._16_4_ =
                             (uint)bVar13 * auVar109._16_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar78 >> 5 & 1);
                        auVar134._20_4_ =
                             (uint)bVar13 * auVar109._20_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar78 >> 6 & 1);
                        auVar134._24_4_ =
                             (uint)bVar13 * auVar109._24_4_ | (uint)!bVar13 * 0x7f800000;
                        auVar134._28_4_ =
                             (uint)(bVar78 >> 7) * auVar109._28_4_ |
                             (uint)!(bool)(bVar78 >> 7) * 0x7f800000;
                        auVar109 = vshufps_avx(auVar134,auVar134,0xb1);
                        auVar109 = vminps_avx(auVar134,auVar109);
                        auVar110 = vshufpd_avx(auVar109,auVar109,5);
                        auVar109 = vminps_avx(auVar109,auVar110);
                        auVar110 = vpermpd_avx2(auVar109,0x4e);
                        auVar109 = vminps_avx(auVar109,auVar110);
                        uVar24 = vcmpps_avx512vl(auVar134,auVar109,0);
                        bVar78 = (byte)uVar24 & bVar78;
                        if (bVar78 != 0) {
                          uVar77 = (uint)bVar78;
                        }
                        uVar71 = 0;
                        for (; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x80000000) {
                          uVar71 = uVar71 + 1;
                        }
                        uVar70 = (ulong)uVar71;
                      } while( true );
                    }
                    fVar166 = local_340[uVar70];
                    uVar144 = *(undefined4 *)(local_320 + uVar70 * 4);
                    fVar158 = 1.0 - fVar166;
                    auVar20 = vfnmadd231ss_fma(ZEXT416((uint)(fVar166 * (fVar158 + fVar158))),
                                               ZEXT416((uint)fVar158),ZEXT416((uint)fVar158));
                    auVar147 = ZEXT416((uint)fVar166);
                    auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar147,
                                              ZEXT416(0xc0a00000));
                    auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar166 * fVar166 * 3.0)),
                                              ZEXT416((uint)(fVar166 + fVar166)),auVar85);
                    auVar213 = ZEXT1664(auVar81);
                    auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar147,
                                              ZEXT416(0x40000000));
                    auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar158 * fVar158 * -3.0)),
                                              ZEXT416((uint)(fVar158 + fVar158)),auVar85);
                    auVar147 = vfmadd231ss_fma(ZEXT416((uint)(fVar166 * fVar166)),auVar147,
                                               ZEXT416((uint)(fVar158 * -2.0)));
                    fVar158 = auVar20._0_4_ * 0.5;
                    fVar159 = auVar81._0_4_ * 0.5;
                    auVar198 = ZEXT464((uint)fVar159);
                    fVar160 = auVar85._0_4_ * 0.5;
                    fVar173 = auVar147._0_4_ * 0.5;
                    auVar181._0_4_ = fVar173 * local_6d0;
                    auVar181._4_4_ = fVar173 * fStack_6cc;
                    auVar181._8_4_ = fVar173 * fStack_6c8;
                    auVar181._12_4_ = fVar173 * fStack_6c4;
                    auVar202._4_4_ = fVar160;
                    auVar202._0_4_ = fVar160;
                    auVar202._8_4_ = fVar160;
                    auVar202._12_4_ = fVar160;
                    auVar85 = vfmadd132ps_fma(auVar202,auVar181,auVar82);
                    auVar209 = ZEXT1664(auVar85);
                    auVar182._4_4_ = fVar159;
                    auVar182._0_4_ = fVar159;
                    auVar182._8_4_ = fVar159;
                    auVar182._12_4_ = fVar159;
                    auVar85 = vfmadd132ps_fma(auVar182,auVar85,auVar21);
                    auVar169._4_4_ = fVar158;
                    auVar169._0_4_ = fVar158;
                    auVar169._8_4_ = fVar158;
                    auVar169._12_4_ = fVar158;
                    auVar85 = vfmadd213ps_fma(auVar169,auVar84,auVar85);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar70 * 4);
                    *(int *)(ray + k * 4 + 0x180) = auVar85._0_4_;
                    uVar11 = vextractps_avx(auVar85,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar11;
                    uVar11 = vextractps_avx(auVar85,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar11;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar166;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar144;
                    *(uint *)(ray + k * 4 + 0x220) = uVar9;
                    *(uint *)(ray + k * 4 + 0x240) = uVar8;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01806c1e;
      }
    }
    uVar144 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar28._4_4_ = uVar144;
    auVar28._0_4_ = uVar144;
    auVar28._8_4_ = uVar144;
    auVar28._12_4_ = uVar144;
    uVar23 = vcmpps_avx512vl(local_2d0,auVar28,2);
    uVar75 = (ulong)((uint)uVar75 & (uint)uVar23);
  } while( true );
LAB_01807035:
  auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar228 = ZEXT1664(auVar85);
  auVar229 = ZEXT3264(local_560);
  auVar230 = ZEXT3264(local_580);
  auVar109 = vmovdqa64_avx512vl(local_120);
  auVar227 = ZEXT3264(auVar109);
LAB_01806c1e:
  lVar72 = lVar72 + 8;
  goto LAB_0180633d;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }